

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BezierCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Primitive PVar16;
  undefined4 uVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined3 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined8 uVar33;
  undefined6 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  byte bVar56;
  ulong uVar57;
  ulong uVar58;
  RTCFilterFunctionN p_Var59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  bool bVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  undefined2 uVar108;
  float fVar72;
  float fVar109;
  float fVar110;
  vfloat_impl<4> p00;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar135;
  float fVar136;
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar149;
  float fVar150;
  vfloat4 v;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar159;
  float fVar160;
  vfloat4 v_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar172;
  float fVar173;
  vfloat4 a;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar200;
  float fVar201;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar205;
  float fVar206;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar220;
  float fVar221;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar226;
  float fVar227;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar256;
  float fVar259;
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar276;
  float fVar279;
  vfloat4 a_1;
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar287;
  float fVar288;
  float fVar298;
  float fVar300;
  vfloat4 a_2;
  float fVar302;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar293 [16];
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar304;
  float fVar305;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar310 [16];
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar321;
  float fVar322;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined8 local_3f8;
  undefined4 local_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  undefined8 uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  ulong local_278;
  Primitive *local_270;
  RTCFilterFunctionNArguments local_268;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar105 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar107;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  
  PVar16 = prim[1];
  uVar57 = (ulong)(byte)PVar16;
  lVar23 = uVar57 * 0x25;
  pPVar8 = prim + lVar23 + 6;
  fVar150 = *(float *)(pPVar8 + 0xc);
  fVar151 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar150;
  fVar159 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar150;
  fVar160 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar150;
  fVar137 = fVar150 * (ray->dir).field_0.m128[0];
  fVar149 = fVar150 * (ray->dir).field_0.m128[1];
  fVar150 = fVar150 * (ray->dir).field_0.m128[2];
  uVar17 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar63;
  auVar125._12_2_ = uVar108;
  auVar125._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar139._12_4_ = auVar125._12_4_;
  auVar139._8_2_ = 0;
  auVar139._0_8_ = uVar63;
  auVar139._10_2_ = uVar108;
  auVar73._10_6_ = auVar139._10_6_;
  auVar73._8_2_ = uVar108;
  auVar73._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar35._4_8_ = auVar73._8_8_;
  auVar35._2_2_ = uVar108;
  auVar35._0_2_ = uVar108;
  fVar321 = (float)((int)sVar71 >> 8);
  fVar327 = (float)(auVar35._0_4_ >> 0x18);
  fVar328 = (float)(auVar73._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar63;
  auVar114._12_2_ = uVar108;
  auVar114._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar63;
  auVar113._10_2_ = uVar108;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar108;
  auVar112._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar36._4_8_ = auVar112._8_8_;
  auVar36._2_2_ = uVar108;
  auVar36._0_2_ = uVar108;
  fVar161 = (float)((int)sVar71 >> 8);
  fVar172 = (float)(auVar36._0_4_ >> 0x18);
  fVar173 = (float)(auVar112._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar63;
  auVar117._12_2_ = uVar108;
  auVar117._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar63;
  auVar116._10_2_ = uVar108;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar108;
  auVar115._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar37._4_8_ = auVar115._8_8_;
  auVar37._2_2_ = uVar108;
  auVar37._0_2_ = uVar108;
  fVar202 = (float)((int)sVar71 >> 8);
  fVar205 = (float)(auVar37._0_4_ >> 0x18);
  fVar206 = (float)(auVar115._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + uVar57 * 0xf + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar63;
  auVar120._12_2_ = uVar108;
  auVar120._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar119._12_4_ = auVar120._12_4_;
  auVar119._8_2_ = 0;
  auVar119._0_8_ = uVar63;
  auVar119._10_2_ = uVar108;
  auVar118._10_6_ = auVar119._10_6_;
  auVar118._8_2_ = uVar108;
  auVar118._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar38._4_8_ = auVar118._8_8_;
  auVar38._2_2_ = uVar108;
  auVar38._0_2_ = uVar108;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar109 = (float)(auVar38._0_4_ >> 0x18);
  fVar110 = (float)(auVar118._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar63;
  auVar177._12_2_ = uVar108;
  auVar177._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar63;
  auVar176._10_2_ = uVar108;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar108;
  auVar175._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar39._4_8_ = auVar175._8_8_;
  auVar39._2_2_ = uVar108;
  auVar39._0_2_ = uVar108;
  fVar207 = (float)((int)sVar71 >> 8);
  fVar220 = (float)(auVar39._0_4_ >> 0x18);
  fVar221 = (float)(auVar175._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + uVar57 + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar63;
  auVar180._12_2_ = uVar108;
  auVar180._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar63;
  auVar179._10_2_ = uVar108;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar108;
  auVar178._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar40._4_8_ = auVar178._8_8_;
  auVar40._2_2_ = uVar108;
  auVar40._0_2_ = uVar108;
  fVar242 = (float)((int)sVar71 >> 8);
  fVar256 = (float)(auVar40._0_4_ >> 0x18);
  fVar259 = (float)(auVar178._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + uVar57 * 0x1a + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar63;
  auVar183._12_2_ = uVar108;
  auVar183._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar63;
  auVar182._10_2_ = uVar108;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar108;
  auVar181._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar41._4_8_ = auVar181._8_8_;
  auVar41._2_2_ = uVar108;
  auVar41._0_2_ = uVar108;
  fVar226 = (float)((int)sVar71 >> 8);
  fVar237 = (float)(auVar41._0_4_ >> 0x18);
  fVar239 = (float)(auVar181._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + uVar57 * 0x1b + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar63;
  auVar186._12_2_ = uVar108;
  auVar186._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar63;
  auVar185._10_2_ = uVar108;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar108;
  auVar184._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar42._4_8_ = auVar184._8_8_;
  auVar42._2_2_ = uVar108;
  auVar42._0_2_ = uVar108;
  fVar264 = (float)((int)sVar71 >> 8);
  fVar276 = (float)(auVar42._0_4_ >> 0x18);
  fVar279 = (float)(auVar184._8_4_ >> 0x18);
  uVar17 = *(undefined4 *)(prim + uVar57 * 0x1c + 6);
  uVar107 = (undefined1)((uint)uVar17 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar17 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar17));
  uVar107 = (undefined1)((uint)uVar17 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar107),uVar107);
  sVar71 = CONCAT11((char)uVar17,(char)uVar17);
  uVar63 = CONCAT62(uVar34,sVar71);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar63;
  auVar189._12_2_ = uVar108;
  auVar189._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar63;
  auVar188._10_2_ = uVar108;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar108;
  auVar187._0_8_ = uVar63;
  uVar108 = (undefined2)uVar34;
  auVar43._4_8_ = auVar187._8_8_;
  auVar43._2_2_ = uVar108;
  auVar43._0_2_ = uVar108;
  fVar111 = (float)((int)sVar71 >> 8);
  fVar135 = (float)(auVar43._0_4_ >> 0x18);
  fVar136 = (float)(auVar187._8_4_ >> 0x18);
  fVar304 = fVar137 * fVar321 + fVar149 * fVar161 + fVar150 * fVar202;
  fVar315 = fVar137 * fVar327 + fVar149 * fVar172 + fVar150 * fVar205;
  fVar317 = fVar137 * fVar328 + fVar149 * fVar173 + fVar150 * fVar206;
  fVar319 = fVar137 * (float)(auVar139._12_4_ >> 0x18) +
            fVar149 * (float)(auVar113._12_4_ >> 0x18) + fVar150 * (float)(auVar116._12_4_ >> 0x18);
  fVar287 = fVar137 * fVar72 + fVar149 * fVar207 + fVar150 * fVar242;
  fVar298 = fVar137 * fVar109 + fVar149 * fVar220 + fVar150 * fVar256;
  fVar300 = fVar137 * fVar110 + fVar149 * fVar221 + fVar150 * fVar259;
  fVar302 = fVar137 * (float)(auVar119._12_4_ >> 0x18) +
            fVar149 * (float)(auVar176._12_4_ >> 0x18) + fVar150 * (float)(auVar179._12_4_ >> 0x18);
  fVar174 = fVar137 * fVar226 + fVar149 * fVar264 + fVar150 * fVar111;
  fVar200 = fVar137 * fVar237 + fVar149 * fVar276 + fVar150 * fVar135;
  fVar201 = fVar137 * fVar239 + fVar149 * fVar279 + fVar150 * fVar136;
  fVar137 = fVar137 * (float)(auVar182._12_4_ >> 0x18) +
            fVar149 * (float)(auVar185._12_4_ >> 0x18) + fVar150 * (float)(auVar188._12_4_ >> 0x18);
  fVar322 = fVar321 * fVar151 + fVar161 * fVar159 + fVar202 * fVar160;
  fVar327 = fVar327 * fVar151 + fVar172 * fVar159 + fVar205 * fVar160;
  fVar328 = fVar328 * fVar151 + fVar173 * fVar159 + fVar206 * fVar160;
  fVar329 = (float)(auVar139._12_4_ >> 0x18) * fVar151 +
            (float)(auVar113._12_4_ >> 0x18) * fVar159 + (float)(auVar116._12_4_ >> 0x18) * fVar160;
  fVar242 = fVar72 * fVar151 + fVar207 * fVar159 + fVar242 * fVar160;
  fVar256 = fVar109 * fVar151 + fVar220 * fVar159 + fVar256 * fVar160;
  fVar259 = fVar110 * fVar151 + fVar221 * fVar159 + fVar259 * fVar160;
  fVar321 = (float)(auVar119._12_4_ >> 0x18) * fVar151 +
            (float)(auVar176._12_4_ >> 0x18) * fVar159 + (float)(auVar179._12_4_ >> 0x18) * fVar160;
  fVar226 = fVar151 * fVar226 + fVar159 * fVar264 + fVar160 * fVar111;
  fVar237 = fVar151 * fVar237 + fVar159 * fVar276 + fVar160 * fVar135;
  fVar239 = fVar151 * fVar239 + fVar159 * fVar279 + fVar160 * fVar136;
  fVar264 = fVar151 * (float)(auVar182._12_4_ >> 0x18) +
            fVar159 * (float)(auVar185._12_4_ >> 0x18) + fVar160 * (float)(auVar188._12_4_ >> 0x18);
  fVar150 = (float)DAT_01f80d30;
  fVar72 = DAT_01f80d30._4_4_;
  fVar109 = DAT_01f80d30._8_4_;
  fVar110 = DAT_01f80d30._12_4_;
  uVar65 = -(uint)(fVar150 <= ABS(fVar304));
  uVar67 = -(uint)(fVar72 <= ABS(fVar315));
  uVar69 = -(uint)(fVar109 <= ABS(fVar317));
  uVar70 = -(uint)(fVar110 <= ABS(fVar319));
  auVar306._0_4_ = (uint)fVar304 & uVar65;
  auVar306._4_4_ = (uint)fVar315 & uVar67;
  auVar306._8_4_ = (uint)fVar317 & uVar69;
  auVar306._12_4_ = (uint)fVar319 & uVar70;
  auVar152._0_4_ = ~uVar65 & (uint)fVar150;
  auVar152._4_4_ = ~uVar67 & (uint)fVar72;
  auVar152._8_4_ = ~uVar69 & (uint)fVar109;
  auVar152._12_4_ = ~uVar70 & (uint)fVar110;
  auVar152 = auVar152 | auVar306;
  uVar65 = -(uint)(fVar150 <= ABS(fVar287));
  uVar67 = -(uint)(fVar72 <= ABS(fVar298));
  uVar69 = -(uint)(fVar109 <= ABS(fVar300));
  uVar70 = -(uint)(fVar110 <= ABS(fVar302));
  auVar289._0_4_ = (uint)fVar287 & uVar65;
  auVar289._4_4_ = (uint)fVar298 & uVar67;
  auVar289._8_4_ = (uint)fVar300 & uVar69;
  auVar289._12_4_ = (uint)fVar302 & uVar70;
  auVar203._0_4_ = ~uVar65 & (uint)fVar150;
  auVar203._4_4_ = ~uVar67 & (uint)fVar72;
  auVar203._8_4_ = ~uVar69 & (uint)fVar109;
  auVar203._12_4_ = ~uVar70 & (uint)fVar110;
  auVar203 = auVar203 | auVar289;
  uVar65 = -(uint)(fVar150 <= ABS(fVar174));
  uVar67 = -(uint)(fVar72 <= ABS(fVar200));
  uVar69 = -(uint)(fVar109 <= ABS(fVar201));
  uVar70 = -(uint)(fVar110 <= ABS(fVar137));
  auVar190._0_4_ = (uint)fVar174 & uVar65;
  auVar190._4_4_ = (uint)fVar200 & uVar67;
  auVar190._8_4_ = (uint)fVar201 & uVar69;
  auVar190._12_4_ = (uint)fVar137 & uVar70;
  auVar208._0_4_ = ~uVar65 & (uint)fVar150;
  auVar208._4_4_ = ~uVar67 & (uint)fVar72;
  auVar208._8_4_ = ~uVar69 & (uint)fVar109;
  auVar208._12_4_ = ~uVar70 & (uint)fVar110;
  auVar208 = auVar208 | auVar190;
  auVar73 = rcpps(_DAT_01f80d30,auVar152);
  fVar150 = auVar73._0_4_;
  fVar110 = auVar73._4_4_;
  fVar161 = auVar73._8_4_;
  fVar207 = auVar73._12_4_;
  fVar150 = (1.0 - auVar152._0_4_ * fVar150) * fVar150 + fVar150;
  fVar110 = (1.0 - auVar152._4_4_ * fVar110) * fVar110 + fVar110;
  fVar161 = (1.0 - auVar152._8_4_ * fVar161) * fVar161 + fVar161;
  fVar207 = (1.0 - auVar152._12_4_ * fVar207) * fVar207 + fVar207;
  auVar73 = rcpps(auVar73,auVar203);
  fVar72 = auVar73._0_4_;
  fVar111 = auVar73._4_4_;
  fVar172 = auVar73._8_4_;
  fVar220 = auVar73._12_4_;
  fVar72 = (1.0 - auVar203._0_4_ * fVar72) * fVar72 + fVar72;
  fVar111 = (1.0 - auVar203._4_4_ * fVar111) * fVar111 + fVar111;
  fVar172 = (1.0 - auVar203._8_4_ * fVar172) * fVar172 + fVar172;
  fVar220 = (1.0 - auVar203._12_4_ * fVar220) * fVar220 + fVar220;
  auVar73 = rcpps(auVar73,auVar208);
  fVar109 = auVar73._0_4_;
  fVar135 = auVar73._4_4_;
  fVar173 = auVar73._8_4_;
  fVar221 = auVar73._12_4_;
  fVar109 = (1.0 - auVar208._0_4_ * fVar109) * fVar109 + fVar109;
  fVar135 = (1.0 - auVar208._4_4_ * fVar135) * fVar135 + fVar135;
  fVar173 = (1.0 - auVar208._8_4_ * fVar173) * fVar173 + fVar173;
  fVar221 = (1.0 - auVar208._12_4_ * fVar221) * fVar221 + fVar221;
  fVar276 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar63 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar108 = (undefined2)(uVar63 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar63;
  auVar74._12_2_ = uVar108;
  auVar74._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar63 >> 0x20);
  auVar250._12_4_ = auVar74._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar63;
  auVar250._10_2_ = uVar108;
  auVar141._10_6_ = auVar250._10_6_;
  auVar141._8_2_ = uVar108;
  auVar141._0_8_ = uVar63;
  uVar108 = (undefined2)(uVar63 >> 0x10);
  auVar44._4_8_ = auVar141._8_8_;
  auVar44._2_2_ = uVar108;
  auVar44._0_2_ = uVar108;
  fVar136 = (float)(auVar44._0_4_ >> 0x10);
  fVar174 = (float)(auVar141._8_4_ >> 0x10);
  uVar58 = *(ulong *)(prim + uVar57 * 0xb + 6);
  uVar108 = (undefined2)(uVar58 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar58;
  auVar155._12_2_ = uVar108;
  auVar155._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar58 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar58;
  auVar154._10_2_ = uVar108;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar108;
  auVar153._0_8_ = uVar58;
  uVar108 = (undefined2)(uVar58 >> 0x10);
  auVar45._4_8_ = auVar153._8_8_;
  auVar45._2_2_ = uVar108;
  auVar45._0_2_ = uVar108;
  uVar60 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar108 = (undefined2)(uVar60 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar60;
  auVar77._12_2_ = uVar108;
  auVar77._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar60 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar60;
  auVar76._10_2_ = uVar108;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar108;
  auVar75._0_8_ = uVar60;
  uVar108 = (undefined2)(uVar60 >> 0x10);
  auVar46._4_8_ = auVar75._8_8_;
  auVar46._2_2_ = uVar108;
  auVar46._0_2_ = uVar108;
  fVar137 = (float)(auVar46._0_4_ >> 0x10);
  fVar200 = (float)(auVar75._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar57 * 0xd + 6);
  uVar108 = (undefined2)(uVar9 >> 0x30);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar9;
  auVar211._12_2_ = uVar108;
  auVar211._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar9 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar9;
  auVar210._10_2_ = uVar108;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar108;
  auVar209._0_8_ = uVar9;
  uVar108 = (undefined2)(uVar9 >> 0x10);
  auVar47._4_8_ = auVar209._8_8_;
  auVar47._2_2_ = uVar108;
  auVar47._0_2_ = uVar108;
  uVar10 = *(ulong *)(prim + uVar57 * 0x12 + 6);
  uVar108 = (undefined2)(uVar10 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._12_2_ = uVar108;
  auVar80._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar10 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar10;
  auVar79._10_2_ = uVar108;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar108;
  auVar78._0_8_ = uVar10;
  uVar108 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar78._8_8_;
  auVar48._2_2_ = uVar108;
  auVar48._0_2_ = uVar108;
  fVar149 = (float)(auVar48._0_4_ >> 0x10);
  fVar201 = (float)(auVar78._8_4_ >> 0x10);
  uVar62 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  uVar11 = *(ulong *)(prim + uVar57 * 2 + uVar62 + 6);
  uVar108 = (undefined2)(uVar11 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar11;
  auVar247._12_2_ = uVar108;
  auVar247._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar11 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar11;
  auVar246._10_2_ = uVar108;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar108;
  auVar245._0_8_ = uVar11;
  uVar108 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar245._8_8_;
  auVar49._2_2_ = uVar108;
  auVar49._0_2_ = uVar108;
  uVar62 = *(ulong *)(prim + uVar62 + 6);
  uVar108 = (undefined2)(uVar62 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar62;
  auVar83._12_2_ = uVar108;
  auVar83._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar62 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar62;
  auVar82._10_2_ = uVar108;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar108;
  auVar81._0_8_ = uVar62;
  uVar108 = (undefined2)(uVar62 >> 0x10);
  auVar50._4_8_ = auVar81._8_8_;
  auVar50._2_2_ = uVar108;
  auVar50._0_2_ = uVar108;
  fVar151 = (float)(auVar50._0_4_ >> 0x10);
  fVar202 = (float)(auVar81._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar57 * 0x18 + 6);
  uVar108 = (undefined2)(uVar12 >> 0x30);
  auVar269._8_4_ = 0;
  auVar269._0_8_ = uVar12;
  auVar269._12_2_ = uVar108;
  auVar269._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar12 >> 0x20);
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._8_2_ = 0;
  auVar268._0_8_ = uVar12;
  auVar268._10_2_ = uVar108;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._8_2_ = uVar108;
  auVar267._0_8_ = uVar12;
  uVar108 = (undefined2)(uVar12 >> 0x10);
  auVar51._4_8_ = auVar267._8_8_;
  auVar51._2_2_ = uVar108;
  auVar51._0_2_ = uVar108;
  uVar13 = *(ulong *)(prim + uVar57 * 0x1d + 6);
  uVar108 = (undefined2)(uVar13 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar13;
  auVar86._12_2_ = uVar108;
  auVar86._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar13 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar13;
  auVar85._10_2_ = uVar108;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar108;
  auVar84._0_8_ = uVar13;
  uVar108 = (undefined2)(uVar13 >> 0x10);
  auVar52._4_8_ = auVar84._8_8_;
  auVar52._2_2_ = uVar108;
  auVar52._0_2_ = uVar108;
  fVar159 = (float)(auVar52._0_4_ >> 0x10);
  fVar205 = (float)(auVar84._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar57 + (ulong)(byte)PVar16 * 0x20 + 6);
  uVar108 = (undefined2)(uVar14 >> 0x30);
  auVar292._8_4_ = 0;
  auVar292._0_8_ = uVar14;
  auVar292._12_2_ = uVar108;
  auVar292._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar14 >> 0x20);
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._8_2_ = 0;
  auVar291._0_8_ = uVar14;
  auVar291._10_2_ = uVar108;
  auVar290._10_6_ = auVar291._10_6_;
  auVar290._8_2_ = uVar108;
  auVar290._0_8_ = uVar14;
  uVar108 = (undefined2)(uVar14 >> 0x10);
  auVar53._4_8_ = auVar290._8_8_;
  auVar53._2_2_ = uVar108;
  auVar53._0_2_ = uVar108;
  uVar15 = *(ulong *)(prim + ((ulong)(byte)PVar16 * 0x20 - uVar57) + 6);
  uVar108 = (undefined2)(uVar15 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar15;
  auVar89._12_2_ = uVar108;
  auVar89._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar15 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar15;
  auVar88._10_2_ = uVar108;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar108;
  auVar87._0_8_ = uVar15;
  uVar108 = (undefined2)(uVar15 >> 0x10);
  auVar54._4_8_ = auVar87._8_8_;
  auVar54._2_2_ = uVar108;
  auVar54._0_2_ = uVar108;
  fVar160 = (float)(auVar54._0_4_ >> 0x10);
  fVar206 = (float)(auVar87._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar57 * 0x23 + 6);
  uVar108 = (undefined2)(uVar57 >> 0x30);
  auVar309._8_4_ = 0;
  auVar309._0_8_ = uVar57;
  auVar309._12_2_ = uVar108;
  auVar309._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar57 >> 0x20);
  auVar308._12_4_ = auVar309._12_4_;
  auVar308._8_2_ = 0;
  auVar308._0_8_ = uVar57;
  auVar308._10_2_ = uVar108;
  auVar307._10_6_ = auVar308._10_6_;
  auVar307._8_2_ = uVar108;
  auVar307._0_8_ = uVar57;
  uVar108 = (undefined2)(uVar57 >> 0x10);
  auVar55._4_8_ = auVar307._8_8_;
  auVar55._2_2_ = uVar108;
  auVar55._0_2_ = uVar108;
  auVar156._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar136) * fVar276 + fVar136) - fVar327) *
                fVar110,((((float)(int)(short)uVar58 - (float)(int)(short)uVar63) * fVar276 +
                         (float)(int)(short)uVar63) - fVar322) * fVar150);
  auVar156._8_4_ =
       ((((float)(auVar153._8_4_ >> 0x10) - fVar174) * fVar276 + fVar174) - fVar328) * fVar161;
  auVar156._12_4_ =
       ((((float)(auVar154._12_4_ >> 0x10) - (float)(auVar250._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar250._12_4_ >> 0x10)) - fVar329) * fVar207;
  auVar212._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar60) * fVar276 +
        (float)(int)(short)uVar60) - fVar322) * fVar150;
  auVar212._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar137) * fVar276 + fVar137) - fVar327) * fVar110;
  auVar212._8_4_ =
       ((((float)(auVar209._8_4_ >> 0x10) - fVar200) * fVar276 + fVar200) - fVar328) * fVar161;
  auVar212._12_4_ =
       ((((float)(auVar210._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar329) * fVar207;
  auVar248._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar149) * fVar276 + fVar149) - fVar256) *
                fVar111,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar276 +
                         (float)(int)(short)uVar10) - fVar242) * fVar72);
  auVar248._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar201) * fVar276 + fVar201) - fVar259) * fVar172;
  auVar248._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar321) * fVar220;
  auVar270._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar62) * fVar276 +
        (float)(int)(short)uVar62) - fVar242) * fVar72;
  auVar270._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar151) * fVar276 + fVar151) - fVar256) * fVar111;
  auVar270._8_4_ =
       ((((float)(auVar267._8_4_ >> 0x10) - fVar202) * fVar276 + fVar202) - fVar259) * fVar172;
  auVar270._12_4_ =
       ((((float)(auVar268._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar321) * fVar220;
  auVar293._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar159) * fVar276 + fVar159) - fVar237) *
                fVar135,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar276 +
                         (float)(int)(short)uVar13) - fVar226) * fVar109);
  auVar293._8_4_ =
       ((((float)(auVar290._8_4_ >> 0x10) - fVar205) * fVar276 + fVar205) - fVar239) * fVar173;
  auVar293._12_4_ =
       ((((float)(auVar291._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar264) * fVar221;
  auVar310._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar15) * fVar276 +
        (float)(int)(short)uVar15) - fVar226) * fVar109;
  auVar310._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar160) * fVar276 + fVar160) - fVar237) * fVar135;
  auVar310._8_4_ =
       ((((float)(auVar307._8_4_ >> 0x10) - fVar206) * fVar276 + fVar206) - fVar239) * fVar173;
  auVar310._12_4_ =
       ((((float)(auVar308._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar276 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar264) * fVar221;
  auVar138._8_4_ = auVar156._8_4_;
  auVar138._0_8_ = auVar156._0_8_;
  auVar138._12_4_ = auVar156._12_4_;
  auVar139 = minps(auVar138,auVar212);
  auVar90._8_4_ = auVar248._8_4_;
  auVar90._0_8_ = auVar248._0_8_;
  auVar90._12_4_ = auVar248._12_4_;
  auVar73 = minps(auVar90,auVar270);
  auVar139 = maxps(auVar139,auVar73);
  auVar91._8_4_ = auVar293._8_4_;
  auVar91._0_8_ = auVar293._0_8_;
  auVar91._12_4_ = auVar293._12_4_;
  auVar73 = minps(auVar91,auVar310);
  uVar17 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar121._4_4_ = uVar17;
  auVar121._0_4_ = uVar17;
  auVar121._8_4_ = uVar17;
  auVar121._12_4_ = uVar17;
  auVar73 = maxps(auVar73,auVar121);
  auVar73 = maxps(auVar139,auVar73);
  local_168 = auVar73._0_4_ * 0.99999964;
  fStack_164 = auVar73._4_4_ * 0.99999964;
  fStack_160 = auVar73._8_4_ * 0.99999964;
  fStack_15c = auVar73._12_4_ * 0.99999964;
  auVar73 = maxps(auVar156,auVar212);
  auVar139 = maxps(auVar248,auVar270);
  auVar73 = minps(auVar73,auVar139);
  auVar139 = maxps(auVar293,auVar310);
  fVar150 = ray->tfar;
  auVar92._4_4_ = fVar150;
  auVar92._0_4_ = fVar150;
  auVar92._8_4_ = fVar150;
  auVar92._12_4_ = fVar150;
  auVar139 = minps(auVar139,auVar92);
  auVar73 = minps(auVar73,auVar139);
  uVar65 = (uint)(byte)PVar16;
  auVar122._0_4_ = -(uint)(uVar65 != 0 && local_168 <= auVar73._0_4_ * 1.0000004);
  auVar122._4_4_ = -(uint)(1 < uVar65 && fStack_164 <= auVar73._4_4_ * 1.0000004);
  auVar122._8_4_ = -(uint)(2 < uVar65 && fStack_160 <= auVar73._8_4_ * 1.0000004);
  auVar122._12_4_ = -(uint)(3 < uVar65 && fStack_15c <= auVar73._12_4_ * 1.0000004);
  uVar65 = movmskps(uVar65,auVar122);
  if (uVar65 == 0) {
    uVar63 = 0;
LAB_00af197f:
    return (bool)((byte)uVar63 & 1);
  }
  uVar65 = uVar65 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
  local_270 = prim;
LAB_00aef560:
  lVar23 = 0;
  if (uVar65 != 0) {
    for (; (uVar65 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
    }
  }
  local_340 = (ulong)*(uint *)(local_270 + 2);
  uVar67 = *(uint *)(local_270 + lVar23 * 4 + 6);
  pGVar18 = (context->scene->geometries).items[local_340].ptr;
  local_288 = pGVar18->fnumTimeSegments;
  fVar150 = (pGVar18->time_range).lower;
  fVar72 = (((ray->dir).field_0.m128[3] - fVar150) / ((pGVar18->time_range).upper - fVar150)) *
           local_288;
  fVar150 = floorf(fVar72);
  if (local_288 + -1.0 <= fVar150) {
    fVar150 = local_288 + -1.0;
  }
  fVar109 = 0.0;
  if (0.0 <= fVar150) {
    fVar109 = fVar150;
  }
  fVar72 = fVar72 - fVar109;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           (ulong)uVar67 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)fVar109 * 0x38;
  lVar20 = *(long *)(_Var19 + lVar61);
  lVar21 = *(long *)(_Var19 + 0x10 + lVar61);
  pfVar3 = (float *)(lVar20 + lVar21 * uVar58);
  fVar150 = *pfVar3;
  fVar109 = pfVar3[1];
  fVar110 = pfVar3[2];
  fVar111 = pfVar3[3];
  lVar23 = uVar58 + 1;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar23);
  lVar1 = uVar58 + 2;
  pfVar4 = (float *)(lVar20 + lVar21 * lVar1);
  lVar2 = uVar58 + 3;
  pfVar5 = (float *)(lVar20 + lVar21 * lVar2);
  fVar135 = *pfVar5;
  fVar136 = pfVar5[1];
  fVar137 = pfVar5[2];
  fVar149 = pfVar5[3];
  lVar20 = *(long *)&pGVar18[4].fnumTimeSegments;
  lVar21 = *(long *)(lVar20 + lVar61);
  lVar22 = *(long *)(lVar20 + 0x10 + lVar61);
  pfVar5 = (float *)(lVar21 + lVar22 * uVar58);
  fVar151 = *pfVar5;
  fVar159 = pfVar5[1];
  fVar160 = pfVar5[2];
  fVar161 = pfVar5[3];
  pfVar5 = (float *)(lVar21 + lVar22 * lVar23);
  pfVar6 = (float *)(lVar21 + lVar22 * lVar1);
  pfVar7 = (float *)(lVar21 + lVar22 * lVar2);
  fVar172 = *pfVar7;
  fVar173 = pfVar7[1];
  fVar174 = pfVar7[2];
  fVar200 = pfVar7[3];
  fVar202 = *pfVar4 * 0.0;
  fVar206 = pfVar4[1] * 0.0;
  fVar220 = pfVar4[2] * 0.0;
  fVar242 = pfVar4[3] * 0.0;
  fVar201 = fVar135 * 0.0 + fVar202;
  fVar205 = fVar136 * 0.0 + fVar206;
  fVar207 = fVar137 * 0.0 + fVar220;
  fVar221 = fVar149 * 0.0 + fVar242;
  fVar319 = *pfVar3 * 0.0;
  fVar327 = pfVar3[1] * 0.0;
  fVar329 = pfVar3[2] * 0.0;
  fVar283 = pfVar3[3] * 0.0;
  fVar279 = fVar319 + fVar201 + fVar150;
  fVar287 = fVar327 + fVar205 + fVar109;
  fVar298 = fVar329 + fVar207 + fVar110;
  fVar300 = fVar283 + fVar221 + fVar111;
  fVar201 = (*pfVar3 * 3.0 + fVar201) - fVar150 * 3.0;
  fVar205 = (pfVar3[1] * 3.0 + fVar205) - fVar109 * 3.0;
  fVar207 = (pfVar3[2] * 3.0 + fVar207) - fVar110 * 3.0;
  fVar221 = (pfVar3[3] * 3.0 + fVar221) - fVar111 * 3.0;
  fVar322 = *pfVar6 * 0.0;
  fVar328 = pfVar6[1] * 0.0;
  fVar280 = pfVar6[2] * 0.0;
  fVar284 = pfVar6[3] * 0.0;
  fVar256 = fVar172 * 0.0 + fVar322;
  fVar259 = fVar173 * 0.0 + fVar328;
  fVar321 = fVar174 * 0.0 + fVar280;
  fVar226 = fVar200 * 0.0 + fVar284;
  fVar288 = *pfVar5 * 0.0;
  fVar299 = pfVar5[1] * 0.0;
  fVar301 = pfVar5[2] * 0.0;
  fVar303 = pfVar5[3] * 0.0;
  fVar305 = fVar288 + fVar256 + fVar151;
  fVar316 = fVar299 + fVar259 + fVar159;
  fVar318 = fVar301 + fVar321 + fVar160;
  fVar320 = fVar303 + fVar226 + fVar161;
  fVar302 = (*pfVar5 * 3.0 + fVar256) - fVar151 * 3.0;
  fVar304 = (pfVar5[1] * 3.0 + fVar259) - fVar159 * 3.0;
  fVar315 = (pfVar5[2] * 3.0 + fVar321) - fVar160 * 3.0;
  fVar317 = (pfVar5[3] * 3.0 + fVar226) - fVar161 * 3.0;
  fVar237 = fVar202 + fVar135 + fVar319 + fVar150 * 0.0;
  fVar239 = fVar206 + fVar136 + fVar327 + fVar109 * 0.0;
  fVar264 = fVar220 + fVar137 + fVar329 + fVar110 * 0.0;
  fVar276 = fVar242 + fVar149 + fVar283 + fVar111 * 0.0;
  fVar256 = ((fVar135 * 3.0 - *pfVar4 * 3.0) + fVar319) - fVar150 * 0.0;
  fVar259 = ((fVar136 * 3.0 - pfVar4[1] * 3.0) + fVar327) - fVar109 * 0.0;
  fVar321 = ((fVar137 * 3.0 - pfVar4[2] * 3.0) + fVar329) - fVar110 * 0.0;
  fVar226 = ((fVar149 * 3.0 - pfVar4[3] * 3.0) + fVar283) - fVar111 * 0.0;
  fVar135 = fVar322 + fVar172 + fVar288 + fVar151 * 0.0;
  fVar136 = fVar328 + fVar173 + fVar299 + fVar159 * 0.0;
  fVar137 = fVar280 + fVar174 + fVar301 + fVar160 * 0.0;
  fVar202 = fVar284 + fVar200 + fVar303 + fVar161 * 0.0;
  fVar150 = ((fVar172 * 3.0 - *pfVar6 * 3.0) + fVar288) - fVar151 * 0.0;
  fVar109 = ((fVar173 * 3.0 - pfVar6[1] * 3.0) + fVar299) - fVar159 * 0.0;
  fVar110 = ((fVar174 * 3.0 - pfVar6[2] * 3.0) + fVar301) - fVar160 * 0.0;
  fVar111 = ((fVar200 * 3.0 - pfVar6[3] * 3.0) + fVar303) - fVar161 * 0.0;
  fVar206 = fVar205 * fVar305 - fVar316 * fVar201;
  fVar242 = fVar207 * fVar316 - fVar318 * fVar205;
  fVar319 = fVar201 * fVar318 - fVar305 * fVar207;
  fVar322 = fVar221 * fVar320 - fVar320 * fVar221;
  fVar172 = fVar205 * fVar302 - fVar304 * fVar201;
  fVar174 = fVar207 * fVar304 - fVar315 * fVar205;
  fVar200 = fVar201 * fVar315 - fVar302 * fVar207;
  fVar149 = fVar259 * fVar135 - fVar136 * fVar256;
  fVar159 = fVar321 * fVar136 - fVar137 * fVar259;
  fVar160 = fVar256 * fVar137 - fVar135 * fVar321;
  fVar161 = fVar226 * fVar202 - fVar202 * fVar226;
  fVar135 = fVar259 * fVar150 - fVar109 * fVar256;
  fVar136 = fVar321 * fVar109 - fVar110 * fVar259;
  fVar110 = fVar256 * fVar110 - fVar150 * fVar321;
  fVar202 = fVar319 * fVar319 + fVar242 * fVar242 + fVar206 * fVar206;
  auVar139 = ZEXT416((uint)fVar202);
  auVar73 = rsqrtss(ZEXT416((uint)fVar202),auVar139);
  fVar150 = auVar73._0_4_;
  fVar220 = fVar150 * 1.5 - fVar150 * fVar150 * fVar202 * 0.5 * fVar150;
  fVar302 = fVar206 * fVar172 + fVar319 * fVar200 + fVar242 * fVar174;
  fVar150 = fVar322 * fVar220;
  auVar73 = rcpss(auVar139,auVar139);
  fVar173 = (2.0 - fVar202 * auVar73._0_4_) * auVar73._0_4_;
  fVar304 = fVar160 * fVar160 + fVar159 * fVar159 + fVar149 * fVar149;
  auVar73 = ZEXT416((uint)fVar304);
  auVar139 = rsqrtss(ZEXT416((uint)fVar304),auVar73);
  fVar109 = auVar139._0_4_;
  fVar151 = fVar109 * 1.5 - fVar109 * fVar109 * fVar304 * 0.5 * fVar109;
  fVar315 = fVar149 * fVar135 + fVar160 * fVar110 + fVar159 * fVar136;
  fVar137 = fVar161 * fVar151;
  auVar73 = rcpss(auVar73,auVar73);
  fVar109 = (2.0 - fVar304 * auVar73._0_4_) * auVar73._0_4_;
  fVar305 = fVar300 * fVar242 * fVar220;
  fVar320 = fVar300 * fVar319 * fVar220;
  fVar222 = fVar300 * fVar206 * fVar220;
  fVar224 = fVar300 * fVar150;
  fVar265 = fVar279 - fVar305;
  fVar277 = fVar287 - fVar320;
  fVar281 = fVar298 - fVar222;
  fVar285 = fVar300 - fVar224;
  fVar243 = fVar300 * fVar173 * (fVar202 * fVar174 - fVar302 * fVar242) * fVar220 +
            fVar221 * fVar242 * fVar220;
  fVar257 = fVar300 * fVar173 * (fVar202 * fVar200 - fVar302 * fVar319) * fVar220 +
            fVar221 * fVar319 * fVar220;
  fVar260 = fVar300 * fVar173 * (fVar202 * fVar172 - fVar302 * fVar206) * fVar220 +
            fVar221 * fVar206 * fVar220;
  fVar262 = fVar300 * fVar173 * (fVar202 * (fVar221 * fVar317 - fVar317 * fVar221) -
                                fVar302 * fVar322) * fVar220 + fVar221 * fVar150;
  fVar305 = fVar305 + fVar279;
  fVar320 = fVar320 + fVar287;
  fVar222 = fVar222 + fVar298;
  fVar224 = fVar224 + fVar300;
  fVar202 = fVar276 * fVar159 * fVar151;
  fVar206 = fVar276 * fVar160 * fVar151;
  fVar220 = fVar276 * fVar149 * fVar151;
  fVar242 = fVar276 * fVar137;
  fVar319 = fVar237 - fVar202;
  fVar328 = fVar239 - fVar206;
  fVar283 = fVar264 - fVar220;
  fVar299 = fVar276 - fVar242;
  fVar279 = fVar276 * fVar109 * (fVar304 * fVar136 - fVar315 * fVar159) * fVar151 +
            fVar226 * fVar159 * fVar151;
  fVar298 = fVar276 * fVar109 * (fVar304 * fVar110 - fVar315 * fVar160) * fVar151 +
            fVar226 * fVar160 * fVar151;
  fVar302 = fVar276 * fVar109 * (fVar304 * fVar135 - fVar315 * fVar149) * fVar151 +
            fVar226 * fVar149 * fVar151;
  fVar315 = fVar276 * fVar109 * (fVar304 * (fVar226 * fVar111 - fVar111 * fVar226) -
                                fVar315 * fVar161) * fVar151 + fVar226 * fVar137;
  fVar202 = fVar202 + fVar237;
  fVar206 = fVar206 + fVar239;
  fVar220 = fVar220 + fVar264;
  fVar242 = fVar242 + fVar276;
  lVar21 = *(long *)(_Var19 + 0x38 + lVar61);
  lVar22 = *(long *)(_Var19 + 0x48 + lVar61);
  pfVar3 = (float *)(lVar21 + lVar22 * uVar58);
  fVar150 = *pfVar3;
  fVar109 = pfVar3[1];
  fVar110 = pfVar3[2];
  fVar111 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar23);
  pfVar4 = (float *)(lVar21 + lVar22 * lVar1);
  pfVar5 = (float *)(lVar21 + lVar22 * lVar2);
  fVar135 = *pfVar5;
  fVar136 = pfVar5[1];
  fVar137 = pfVar5[2];
  fVar149 = pfVar5[3];
  lVar21 = *(long *)(lVar20 + 0x38 + lVar61);
  lVar20 = *(long *)(lVar20 + 0x48 + lVar61);
  uVar58 = uVar58 * lVar20;
  pfVar5 = (float *)(lVar21 + lVar20 * lVar2);
  fVar151 = *pfVar5;
  fVar159 = pfVar5[1];
  fVar160 = pfVar5[2];
  fVar161 = pfVar5[3];
  fVar287 = *pfVar4 * 0.0;
  fVar300 = pfVar4[1] * 0.0;
  fVar304 = pfVar4[2] * 0.0;
  fVar317 = pfVar4[3] * 0.0;
  fVar327 = fVar135 * 0.0 + fVar287;
  fVar280 = fVar136 * 0.0 + fVar300;
  fVar288 = fVar137 * 0.0 + fVar304;
  fVar303 = fVar149 * 0.0 + fVar317;
  fVar322 = *pfVar3 * 0.0;
  fVar329 = pfVar3[1] * 0.0;
  fVar284 = pfVar3[2] * 0.0;
  fVar301 = pfVar3[3] * 0.0;
  fVar237 = (*pfVar3 * 3.0 + fVar327) - fVar150 * 3.0;
  fVar239 = (pfVar3[1] * 3.0 + fVar280) - fVar109 * 3.0;
  fVar264 = (pfVar3[2] * 3.0 + fVar288) - fVar110 * 3.0;
  fVar276 = (pfVar3[3] * 3.0 + fVar303) - fVar111 * 3.0;
  pfVar3 = (float *)(lVar21 + lVar1 * lVar20);
  fVar244 = *pfVar3 * 0.0;
  fVar258 = pfVar3[1] * 0.0;
  fVar261 = pfVar3[2] * 0.0;
  fVar263 = pfVar3[3] * 0.0;
  fVar227 = fVar151 * 0.0 + fVar244;
  fVar238 = fVar159 * 0.0 + fVar258;
  fVar240 = fVar160 * 0.0 + fVar261;
  fVar241 = fVar161 * 0.0 + fVar263;
  pfVar5 = (float *)(lVar21 + lVar23 * lVar20);
  fVar266 = *pfVar5 * 0.0;
  fVar278 = pfVar5[1] * 0.0;
  fVar282 = pfVar5[2] * 0.0;
  fVar286 = pfVar5[3] * 0.0;
  pfVar6 = (float *)(lVar21 + uVar58);
  fVar172 = *pfVar6;
  fVar173 = pfVar6[1];
  fVar174 = pfVar6[2];
  fVar200 = pfVar6[3];
  fVar316 = (*pfVar5 * 3.0 + fVar227) - fVar172 * 3.0;
  fVar318 = (pfVar5[1] * 3.0 + fVar238) - fVar173 * 3.0;
  fVar223 = (pfVar5[2] * 3.0 + fVar240) - fVar174 * 3.0;
  fVar225 = (pfVar5[3] * 3.0 + fVar241) - fVar200 * 3.0;
  fVar327 = fVar322 + fVar327 + fVar150;
  fVar280 = fVar329 + fVar280 + fVar109;
  fVar288 = fVar284 + fVar288 + fVar110;
  fVar303 = fVar301 + fVar303 + fVar111;
  fVar287 = fVar287 + fVar135 + fVar322 + fVar150 * 0.0;
  fVar300 = fVar300 + fVar136 + fVar329 + fVar109 * 0.0;
  fVar304 = fVar304 + fVar137 + fVar284 + fVar110 * 0.0;
  fVar317 = fVar317 + fVar149 + fVar301 + fVar111 * 0.0;
  fVar150 = ((fVar135 * 3.0 - *pfVar4 * 3.0) + fVar322) - fVar150 * 0.0;
  fVar109 = ((fVar136 * 3.0 - pfVar4[1] * 3.0) + fVar329) - fVar109 * 0.0;
  fVar110 = ((fVar137 * 3.0 - pfVar4[2] * 3.0) + fVar284) - fVar110 * 0.0;
  fVar111 = ((fVar149 * 3.0 - pfVar4[3] * 3.0) + fVar301) - fVar111 * 0.0;
  fVar149 = fVar266 + fVar227 + fVar172;
  fVar227 = fVar278 + fVar238 + fVar173;
  fVar238 = fVar282 + fVar240 + fVar174;
  fVar240 = fVar286 + fVar241 + fVar200;
  fVar322 = fVar244 + fVar151 + fVar266 + fVar172 * 0.0;
  fVar329 = fVar258 + fVar159 + fVar278 + fVar173 * 0.0;
  fVar284 = fVar261 + fVar160 + fVar282 + fVar174 * 0.0;
  fVar301 = fVar263 + fVar161 + fVar286 + fVar200 * 0.0;
  fVar135 = ((fVar151 * 3.0 - *pfVar3 * 3.0) + fVar266) - fVar172 * 0.0;
  fVar136 = ((fVar159 * 3.0 - pfVar3[1] * 3.0) + fVar278) - fVar173 * 0.0;
  fVar137 = ((fVar160 * 3.0 - pfVar3[2] * 3.0) + fVar282) - fVar174 * 0.0;
  fVar161 = ((fVar161 * 3.0 - pfVar3[3] * 3.0) + fVar286) - fVar200 * 0.0;
  fVar160 = fVar239 * fVar149 - fVar227 * fVar237;
  fVar172 = fVar264 * fVar227 - fVar238 * fVar239;
  fVar238 = fVar237 * fVar238 - fVar149 * fVar264;
  fVar241 = fVar276 * fVar240 - fVar240 * fVar276;
  fVar149 = fVar239 * fVar316 - fVar318 * fVar237;
  fVar151 = fVar264 * fVar318 - fVar223 * fVar239;
  fVar159 = fVar237 * fVar223 - fVar316 * fVar264;
  fVar316 = fVar109 * fVar322 - fVar329 * fVar150;
  fVar223 = fVar110 * fVar329 - fVar284 * fVar109;
  fVar227 = fVar150 * fVar284 - fVar322 * fVar110;
  fVar240 = fVar111 * fVar301 - fVar301 * fVar111;
  fVar173 = fVar109 * fVar135 - fVar136 * fVar150;
  fVar200 = fVar110 * fVar136 - fVar137 * fVar109;
  fVar329 = fVar150 * fVar137 - fVar135 * fVar110;
  fVar135 = fVar238 * fVar238 + fVar172 * fVar172 + fVar160 * fVar160;
  auVar73 = ZEXT416((uint)fVar135);
  auVar139 = rsqrtss(ZEXT416((uint)fVar135),auVar73);
  fVar136 = auVar139._0_4_;
  fVar318 = fVar136 * 1.5 - fVar136 * fVar136 * fVar135 * 0.5 * fVar136;
  fVar263 = fVar160 * fVar149 + fVar238 * fVar159 + fVar172 * fVar151;
  auVar73 = rcpss(auVar73,auVar73);
  fVar136 = (2.0 - fVar135 * auVar73._0_4_) * auVar73._0_4_;
  fVar137 = fVar241 * fVar318;
  fVar244 = fVar227 * fVar227 + fVar223 * fVar223 + fVar316 * fVar316;
  auVar73 = ZEXT416((uint)fVar244);
  auVar139 = rsqrtss(ZEXT416((uint)fVar244),auVar73);
  fVar174 = auVar139._0_4_;
  fVar261 = fVar174 * 1.5 - fVar174 * fVar174 * fVar244 * 0.5 * fVar174;
  fVar266 = fVar316 * fVar173 + fVar227 * fVar329 + fVar223 * fVar200;
  auVar73 = rcpss(auVar73,auVar73);
  fVar278 = (2.0 - fVar244 * auVar73._0_4_) * auVar73._0_4_;
  fVar258 = fVar240 * fVar261;
  fVar174 = fVar303 * fVar172 * fVar318;
  fVar322 = fVar303 * fVar238 * fVar318;
  fVar284 = fVar303 * fVar160 * fVar318;
  fVar301 = fVar303 * fVar137;
  fVar151 = fVar303 * fVar136 * (fVar135 * fVar151 - fVar263 * fVar172) * fVar318 +
            fVar276 * fVar172 * fVar318;
  fVar159 = fVar303 * fVar136 * (fVar135 * fVar159 - fVar263 * fVar238) * fVar318 +
            fVar276 * fVar238 * fVar318;
  fVar160 = fVar303 * fVar136 * (fVar135 * fVar149 - fVar263 * fVar160) * fVar318 +
            fVar276 * fVar160 * fVar318;
  fVar172 = fVar303 * fVar136 * (fVar135 * (fVar276 * fVar225 - fVar225 * fVar276) -
                                fVar263 * fVar241) * fVar318 + fVar276 * fVar137;
  fVar318 = fVar327 - fVar174;
  fVar225 = fVar280 - fVar322;
  fVar238 = fVar288 - fVar284;
  fVar241 = fVar303 - fVar301;
  fVar174 = fVar174 + fVar327;
  fVar322 = fVar322 + fVar280;
  fVar284 = fVar284 + fVar288;
  fVar301 = fVar301 + fVar303;
  fVar135 = fVar317 * fVar223 * fVar261;
  fVar136 = fVar317 * fVar227 * fVar261;
  fVar137 = fVar317 * fVar316 * fVar261;
  fVar149 = fVar317 * fVar258;
  fVar280 = fVar317 * fVar278 * (fVar244 * fVar200 - fVar266 * fVar223) * fVar261 +
            fVar111 * fVar223 * fVar261;
  fVar329 = fVar317 * fVar278 * (fVar244 * fVar329 - fVar266 * fVar227) * fVar261 +
            fVar111 * fVar227 * fVar261;
  fVar288 = fVar317 * fVar278 * (fVar244 * fVar173 - fVar266 * fVar316) * fVar261 +
            fVar111 * fVar316 * fVar261;
  fVar303 = fVar317 * fVar278 * (fVar244 * (fVar111 * fVar161 - fVar161 * fVar111) -
                                fVar266 * fVar240) * fVar261 + fVar111 * fVar258;
  fVar161 = fVar287 - fVar135;
  fVar173 = fVar300 - fVar136;
  fVar200 = fVar304 - fVar137;
  fVar327 = fVar317 - fVar149;
  fVar135 = fVar135 + fVar287;
  fVar136 = fVar136 + fVar300;
  fVar137 = fVar137 + fVar304;
  fVar149 = fVar149 + fVar317;
  fVar287 = 1.0 - fVar72;
  local_378 = fVar265 * fVar287 + fVar318 * fVar72;
  fStack_374 = fVar277 * fVar287 + fVar225 * fVar72;
  fStack_370 = fVar281 * fVar287 + fVar238 * fVar72;
  fStack_36c = fVar285 * fVar287 + fVar241 * fVar72;
  local_388 = ((fVar201 - fVar243) * 0.33333334 + fVar265) * fVar287 +
              ((fVar237 - fVar151) * 0.33333334 + fVar318) * fVar72;
  fStack_384 = ((fVar205 - fVar257) * 0.33333334 + fVar277) * fVar287 +
               ((fVar239 - fVar159) * 0.33333334 + fVar225) * fVar72;
  fStack_380 = ((fVar207 - fVar260) * 0.33333334 + fVar281) * fVar287 +
               ((fVar264 - fVar160) * 0.33333334 + fVar238) * fVar72;
  fStack_37c = ((fVar221 - fVar262) * 0.33333334 + fVar285) * fVar287 +
               ((fVar276 - fVar172) * 0.33333334 + fVar241) * fVar72;
  local_3a8 = (fVar319 - (fVar256 - fVar279) * 0.33333334) * fVar287 +
              (fVar161 - (fVar150 - fVar280) * 0.33333334) * fVar72;
  fStack_3a4 = (fVar328 - (fVar259 - fVar298) * 0.33333334) * fVar287 +
               (fVar173 - (fVar109 - fVar329) * 0.33333334) * fVar72;
  fStack_3a0 = (fVar283 - (fVar321 - fVar302) * 0.33333334) * fVar287 +
               (fVar200 - (fVar110 - fVar288) * 0.33333334) * fVar72;
  fStack_39c = (fVar299 - (fVar226 - fVar315) * 0.33333334) * fVar287 +
               (fVar327 - (fVar111 - fVar303) * 0.33333334) * fVar72;
  local_398 = fVar319 * fVar287 + fVar161 * fVar72;
  fStack_394 = fVar328 * fVar287 + fVar173 * fVar72;
  fStack_390 = fVar283 * fVar287 + fVar200 * fVar72;
  fStack_38c = fVar299 * fVar287 + fVar327 * fVar72;
  local_368 = fVar305 * fVar287 + fVar174 * fVar72;
  fStack_364 = fVar320 * fVar287 + fVar322 * fVar72;
  fStack_360 = fVar222 * fVar287 + fVar284 * fVar72;
  fStack_35c = fVar224 * fVar287 + fVar301 * fVar72;
  local_358 = ((fVar243 + fVar201) * 0.33333334 + fVar305) * fVar287 +
              ((fVar151 + fVar237) * 0.33333334 + fVar174) * fVar72;
  fStack_354 = ((fVar257 + fVar205) * 0.33333334 + fVar320) * fVar287 +
               ((fVar159 + fVar239) * 0.33333334 + fVar322) * fVar72;
  fStack_350 = ((fVar260 + fVar207) * 0.33333334 + fVar222) * fVar287 +
               ((fVar160 + fVar264) * 0.33333334 + fVar284) * fVar72;
  fStack_34c = ((fVar262 + fVar221) * 0.33333334 + fVar224) * fVar287 +
               ((fVar172 + fVar276) * 0.33333334 + fVar301) * fVar72;
  local_3c8 = (fVar202 - (fVar279 + fVar256) * 0.33333334) * fVar287 +
              (fVar135 - (fVar280 + fVar150) * 0.33333334) * fVar72;
  fStack_3c4 = (fVar206 - (fVar298 + fVar259) * 0.33333334) * fVar287 +
               (fVar136 - (fVar329 + fVar109) * 0.33333334) * fVar72;
  fStack_3c0 = (fVar220 - (fVar302 + fVar321) * 0.33333334) * fVar287 +
               (fVar137 - (fVar288 + fVar110) * 0.33333334) * fVar72;
  fStack_3bc = (fVar242 - (fVar315 + fVar226) * 0.33333334) * fVar287 +
               (fVar149 - (fVar303 + fVar111) * 0.33333334) * fVar72;
  local_208 = fVar287 * fVar202 + fVar72 * fVar135;
  fStack_204 = fVar287 * fVar206 + fVar72 * fVar136;
  fStack_200 = fVar287 * fVar220 + fVar72 * fVar137;
  fStack_1fc = fVar287 * fVar242 + fVar72 * fVar149;
  fVar150 = (ray->org).field_0.m128[0];
  fVar72 = (ray->org).field_0.m128[1];
  fVar109 = (ray->org).field_0.m128[2];
  fVar110 = (pre->ray_space).vx.field_0.m128[0];
  fVar111 = (pre->ray_space).vx.field_0.m128[1];
  fVar135 = (pre->ray_space).vy.field_0.m128[0];
  fVar136 = (pre->ray_space).vy.field_0.m128[1];
  fVar137 = (pre->ray_space).vz.field_0.m128[0];
  fVar149 = (pre->ray_space).vz.field_0.m128[1];
  fVar160 = (local_378 - fVar150) * fVar110 +
            (fStack_374 - fVar72) * fVar135 + (fStack_370 - fVar109) * fVar137;
  fVar161 = (local_378 - fVar150) * fVar111 +
            (fStack_374 - fVar72) * fVar136 + (fStack_370 - fVar109) * fVar149;
  local_2b8 = CONCAT44(fVar161,fVar160);
  fVar151 = (local_388 - fVar150) * fVar110 +
            (fStack_384 - fVar72) * fVar135 + (fStack_380 - fVar109) * fVar137;
  fVar159 = (local_388 - fVar150) * fVar111 +
            (fStack_384 - fVar72) * fVar136 + (fStack_380 - fVar109) * fVar149;
  local_2c8 = CONCAT44(fVar159,fVar151);
  fVar201 = (local_3a8 - fVar150) * fVar110 +
            (fStack_3a4 - fVar72) * fVar135 + (fStack_3a0 - fVar109) * fVar137;
  fVar202 = (local_3a8 - fVar150) * fVar111 +
            (fStack_3a4 - fVar72) * fVar136 + (fStack_3a0 - fVar109) * fVar149;
  local_2d8 = CONCAT44(fVar202,fVar201);
  fVar174 = (local_398 - fVar150) * fVar110 +
            (fStack_394 - fVar72) * fVar135 + (fStack_390 - fVar109) * fVar137;
  fVar200 = (local_398 - fVar150) * fVar111 +
            (fStack_394 - fVar72) * fVar136 + (fStack_390 - fVar109) * fVar149;
  local_2e8 = CONCAT44(fVar200,fVar174);
  local_2f8 = (local_368 - fVar150) * fVar110 +
              (fStack_364 - fVar72) * fVar135 + (fStack_360 - fVar109) * fVar137;
  fStack_2f4 = (local_368 - fVar150) * fVar111 +
               (fStack_364 - fVar72) * fVar136 + (fStack_360 - fVar109) * fVar149;
  fVar172 = (local_358 - fVar150) * fVar110 +
            (fStack_354 - fVar72) * fVar135 + (fStack_350 - fVar109) * fVar137;
  fVar173 = (local_358 - fVar150) * fVar111 +
            (fStack_354 - fVar72) * fVar136 + (fStack_350 - fVar109) * fVar149;
  uStack_290 = CONCAT44(fVar173,fVar172);
  local_318 = (local_3c8 - fVar150) * fVar110 +
              (fStack_3c4 - fVar72) * fVar135 + (fStack_3c0 - fVar109) * fVar137;
  fStack_314 = (local_3c8 - fVar150) * fVar111 +
               (fStack_3c4 - fVar72) * fVar136 + (fStack_3c0 - fVar109) * fVar149;
  fVar110 = (local_208 - fVar150) * fVar110 +
            (fStack_204 - fVar72) * fVar135 + (fStack_200 - fVar109) * fVar137;
  fVar150 = (local_208 - fVar150) * fVar111 +
            (fStack_204 - fVar72) * fVar136 + (fStack_200 - fVar109) * fVar149;
  local_328 = CONCAT44(fVar150,fVar110);
  auVar311._8_8_ = uStack_290;
  auVar311._0_8_ = local_2c8;
  auVar228._8_8_ = local_328;
  auVar228._0_8_ = local_2e8;
  auVar93._8_4_ = local_2f8;
  auVar93._0_8_ = local_2b8;
  auVar93._12_4_ = fStack_2f4;
  auVar73 = minps(auVar93,auVar311);
  auVar123._8_4_ = local_318;
  auVar123._0_8_ = local_2d8;
  auVar123._12_4_ = fStack_314;
  auVar139 = minps(auVar123,auVar228);
  auVar73 = minps(auVar73,auVar139);
  auVar124._4_4_ = fVar161;
  auVar124._0_4_ = fVar160;
  auVar124._8_4_ = local_2f8;
  auVar124._12_4_ = fStack_2f4;
  auVar139 = maxps(auVar124,auVar311);
  auVar140._4_4_ = fVar202;
  auVar140._0_4_ = fVar201;
  auVar140._8_4_ = local_318;
  auVar140._12_4_ = fStack_314;
  auVar141 = maxps(auVar140,auVar228);
  auVar125 = maxps(auVar139,auVar141);
  auVar24._4_8_ = auVar141._8_8_;
  auVar24._0_4_ = auVar73._4_4_;
  auVar142._0_8_ = auVar24._0_8_ << 0x20;
  auVar142._8_4_ = auVar73._8_4_;
  auVar142._12_4_ = auVar73._12_4_;
  auVar143._8_8_ = auVar73._8_8_;
  auVar143._0_8_ = auVar142._8_8_;
  auVar139 = minps(auVar73,auVar143);
  auVar25._4_8_ = auVar73._8_8_;
  auVar25._0_4_ = auVar125._4_4_;
  auVar144._0_8_ = auVar25._0_8_ << 0x20;
  auVar144._8_4_ = auVar125._8_4_;
  auVar144._12_4_ = auVar125._12_4_;
  auVar145._8_8_ = auVar125._8_8_;
  auVar145._0_8_ = auVar144._8_8_;
  auVar73 = maxps(auVar125,auVar145);
  auVar94._0_8_ = auVar139._0_8_ & 0x7fffffff7fffffff;
  auVar94._8_4_ = auVar139._8_4_ & 0x7fffffff;
  auVar94._12_4_ = auVar139._12_4_ & 0x7fffffff;
  auVar126._0_8_ = auVar73._0_8_ & 0x7fffffff7fffffff;
  auVar126._8_4_ = auVar73._8_4_ & 0x7fffffff;
  auVar126._12_4_ = auVar73._12_4_ & 0x7fffffff;
  auVar73 = maxps(auVar94,auVar126);
  fStack_284 = auVar73._4_4_;
  local_288 = fStack_284;
  if (fStack_284 <= auVar73._0_4_) {
    local_288 = auVar73._0_4_;
  }
  local_288 = local_288 * 9.536743e-07;
  register0x00001488 = local_2b8;
  register0x00001388 = local_2c8;
  register0x000015c8 = local_2d8;
  register0x00001588 = local_2e8;
  register0x00001288 = uStack_290;
  local_308 = uStack_290;
  register0x00001348 = local_328;
  local_138 = local_288;
  fStack_134 = local_288;
  fStack_130 = local_288;
  fStack_12c = local_288;
  local_148 = -local_288;
  fStack_144 = -local_288;
  fStack_140 = -local_288;
  fStack_13c = -local_288;
  afStack_1e8[0] = local_2f8;
  afStack_1e8[1] = fStack_2f4;
  local_88 = fVar151 - fVar160;
  fStack_84 = fVar159 - fVar161;
  fStack_80 = fVar172 - local_2f8;
  fStack_7c = fVar173 - fStack_2f4;
  local_98 = fVar201 - fVar151;
  fStack_94 = fVar202 - fVar159;
  fStack_90 = local_318 - fVar172;
  fStack_8c = fStack_314 - fVar173;
  fStack_294 = fStack_314;
  local_298 = local_318;
  local_a8 = fVar174 - fVar201;
  fStack_a4 = fVar200 - fVar202;
  fStack_a0 = fVar110 - local_318;
  fStack_9c = fVar150 - fStack_314;
  local_178 = local_368 - local_378;
  fStack_174 = fStack_364 - fStack_374;
  fStack_170 = fStack_360 - fStack_370;
  fStack_16c = fStack_35c - fStack_36c;
  local_188 = local_358 - local_388;
  fStack_184 = fStack_354 - fStack_384;
  fStack_180 = fStack_350 - fStack_380;
  fStack_17c = fStack_34c - fStack_37c;
  local_198 = local_3c8 - local_3a8;
  fStack_194 = fStack_3c4 - fStack_3a4;
  fStack_190 = fStack_3c0 - fStack_3a0;
  fStack_18c = fStack_3bc - fStack_39c;
  local_1a8 = local_208 - local_398;
  fStack_1a4 = fStack_204 - fStack_394;
  fStack_1a0 = fStack_200 - fStack_390;
  fStack_19c = fStack_1fc - fStack_38c;
  uVar63 = 0;
  uVar60 = 0;
  fVar111 = 0.0;
  fVar135 = 1.0;
  fVar72 = 0.0;
  fVar109 = 1.0;
  fStack_310 = local_318;
  fStack_30c = fStack_314;
  fStack_2f0 = local_2f8;
  fStack_2ec = fStack_2f4;
  local_2a8 = local_2d8;
  fStack_280 = fStack_284;
  fStack_27c = fStack_284;
  local_278 = (ulong)uVar67;
  local_1f8 = local_2b8;
LAB_00af0220:
  do {
    fVar136 = 1.0 - fVar72;
    fVar137 = 1.0 - fVar72;
    fVar149 = 1.0 - fVar109;
    fVar151 = 1.0 - fVar109;
    fVar221 = local_2b8._0_4_ * fVar136 + local_2f8 * fVar72;
    fVar237 = local_2b8._4_4_ * fVar137 + fStack_2f4 * fVar72;
    fVar239 = local_2b8._8_4_ * fVar149 + fStack_2f0 * fVar109;
    fVar279 = local_2b8._12_4_ * fVar151 + fStack_2ec * fVar109;
    fVar161 = local_2c8._0_4_ * fVar136 + local_308._0_4_ * fVar72;
    fVar259 = local_2c8._4_4_ * fVar137 + local_308._4_4_ * fVar72;
    fVar321 = local_2c8._8_4_ * fVar149 + local_308._8_4_ * fVar109;
    fVar226 = local_2c8._12_4_ * fVar151 + local_308._12_4_ * fVar109;
    fVar317 = local_2d8._0_4_ * fVar136 + local_318 * fVar72;
    fVar319 = local_2d8._4_4_ * fVar137 + fStack_314 * fVar72;
    fVar322 = local_2d8._8_4_ * fVar149 + fStack_310 * fVar109;
    fVar327 = local_2d8._12_4_ * fVar151 + fStack_30c * fVar109;
    fVar264 = fVar136 * local_2e8._0_4_ + fVar72 * local_328._0_4_;
    fVar276 = fVar137 * local_2e8._4_4_ + fVar72 * local_328._4_4_;
    fVar287 = fVar149 * local_2e8._8_4_ + fVar109 * local_328._8_4_;
    fVar298 = fVar151 * local_2e8._12_4_ + fVar109 * local_328._12_4_;
    fVar300 = (fVar135 - fVar111) * 0.11111111;
    local_3f8 = CONCAT44(fVar135,fVar111);
    fVar302 = (fVar135 - fVar111) * 0.0 + fVar111;
    fVar304 = (fVar135 - fVar111) * 0.33333334 + fVar111;
    fVar315 = (fVar135 - fVar111) * 0.6666667 + fVar111;
    fVar111 = (fVar135 - fVar111) * 1.0 + fVar111;
    fVar135 = 1.0 - fVar302;
    fVar136 = 1.0 - fVar304;
    fVar137 = 1.0 - fVar315;
    fVar160 = 1.0 - fVar111;
    fVar172 = fVar161 * fVar135 + fVar317 * fVar302;
    fVar173 = fVar161 * fVar136 + fVar317 * fVar304;
    fVar201 = fVar161 * fVar137 + fVar317 * fVar315;
    fVar202 = fVar161 * fVar160 + fVar317 * fVar111;
    fVar205 = fVar259 * fVar135 + fVar319 * fVar302;
    fVar206 = fVar259 * fVar136 + fVar319 * fVar304;
    fVar207 = fVar259 * fVar137 + fVar319 * fVar315;
    fVar220 = fVar259 * fVar160 + fVar319 * fVar111;
    fVar149 = (fVar221 * fVar135 + fVar161 * fVar302) * fVar135 + fVar302 * fVar172;
    fVar151 = (fVar221 * fVar136 + fVar161 * fVar304) * fVar136 + fVar304 * fVar173;
    fVar159 = (fVar221 * fVar137 + fVar161 * fVar315) * fVar137 + fVar315 * fVar201;
    fVar161 = (fVar221 * fVar160 + fVar161 * fVar111) * fVar160 + fVar111 * fVar202;
    fVar221 = (fVar237 * fVar135 + fVar259 * fVar302) * fVar135 + fVar302 * fVar205;
    fVar242 = (fVar237 * fVar136 + fVar259 * fVar304) * fVar136 + fVar304 * fVar206;
    fVar256 = (fVar237 * fVar137 + fVar259 * fVar315) * fVar137 + fVar315 * fVar207;
    fVar259 = (fVar237 * fVar160 + fVar259 * fVar111) * fVar160 + fVar111 * fVar220;
    fVar172 = fVar172 * fVar135 + (fVar317 * fVar135 + fVar264 * fVar302) * fVar302;
    fVar173 = fVar173 * fVar136 + (fVar317 * fVar136 + fVar264 * fVar304) * fVar304;
    fVar201 = fVar201 * fVar137 + (fVar317 * fVar137 + fVar264 * fVar315) * fVar315;
    fVar202 = fVar202 * fVar160 + (fVar317 * fVar160 + fVar264 * fVar111) * fVar111;
    fVar205 = fVar205 * fVar135 + (fVar319 * fVar135 + fVar276 * fVar302) * fVar302;
    fVar206 = fVar206 * fVar136 + (fVar319 * fVar136 + fVar276 * fVar304) * fVar304;
    fVar207 = fVar207 * fVar137 + (fVar319 * fVar137 + fVar276 * fVar315) * fVar315;
    fVar220 = fVar220 * fVar160 + (fVar319 * fVar160 + fVar276 * fVar111) * fVar111;
    local_238 = fVar135 * fVar149 + fVar302 * fVar172;
    fStack_234 = fVar136 * fVar151 + fVar304 * fVar173;
    fStack_230 = fVar137 * fVar159 + fVar315 * fVar201;
    fStack_22c = fVar160 * fVar161 + fVar111 * fVar202;
    local_128 = fVar135 * fVar221 + fVar302 * fVar205;
    fStack_124 = fVar136 * fVar242 + fVar304 * fVar206;
    fStack_120 = fVar137 * fVar256 + fVar315 * fVar207;
    fStack_11c = fVar160 * fVar259 + fVar111 * fVar220;
    fVar151 = (fVar173 - fVar151) * 3.0 * fVar300;
    fVar159 = (fVar201 - fVar159) * 3.0 * fVar300;
    fVar161 = (fVar202 - fVar161) * 3.0 * fVar300;
    fVar173 = (fVar206 - fVar242) * 3.0 * fVar300;
    fVar201 = (fVar207 - fVar256) * 3.0 * fVar300;
    fVar202 = (fVar220 - fVar259) * 3.0 * fVar300;
    local_3b8._4_4_ = fStack_230;
    local_3b8._0_4_ = fStack_234;
    local_3b8._8_4_ = fStack_22c;
    local_3b8._12_4_ = 0;
    local_c8._4_4_ = fStack_120;
    local_c8._0_4_ = fStack_124;
    local_218 = local_238 + (fVar172 - fVar149) * 3.0 * fVar300;
    fStack_214 = fStack_234 + fVar151;
    fStack_210 = fStack_230 + fVar159;
    fStack_20c = fStack_22c + fVar161;
    local_338._0_4_ = local_128 + (fVar205 - fVar221) * 3.0 * fVar300;
    local_338._4_4_ = fStack_124 + fVar173;
    fStack_330 = fStack_120 + fVar201;
    fStack_32c = fStack_11c + fVar202;
    local_228._0_4_ = fStack_234 - fVar151;
    local_228._4_4_ = fStack_230 - fVar159;
    local_228._8_4_ = fStack_22c - fVar161;
    local_228._12_4_ = 0;
    local_408._0_4_ = fStack_124 - fVar173;
    local_408._4_4_ = fStack_120 - fVar201;
    fStack_400 = fStack_11c - fVar202;
    fStack_3fc = 0.0;
    fVar149 = fVar321 * fVar135 + fVar322 * fVar302;
    fVar151 = fVar321 * fVar136 + fVar322 * fVar304;
    fVar159 = fVar321 * fVar137 + fVar322 * fVar315;
    fVar161 = fVar321 * fVar160 + fVar322 * fVar111;
    fVar172 = fVar226 * fVar135 + fVar327 * fVar302;
    fVar173 = fVar226 * fVar136 + fVar327 * fVar304;
    fVar201 = fVar226 * fVar137 + fVar327 * fVar315;
    fVar237 = fVar226 * fVar160 + fVar327 * fVar111;
    fVar202 = (fVar239 * fVar135 + fVar321 * fVar302) * fVar135 + fVar302 * fVar149;
    fVar205 = (fVar239 * fVar136 + fVar321 * fVar304) * fVar136 + fVar304 * fVar151;
    fVar206 = (fVar239 * fVar137 + fVar321 * fVar315) * fVar137 + fVar315 * fVar159;
    fVar207 = (fVar239 * fVar160 + fVar321 * fVar111) * fVar160 + fVar111 * fVar161;
    fVar239 = (fVar279 * fVar135 + fVar226 * fVar302) * fVar135 + fVar302 * fVar172;
    fVar264 = (fVar279 * fVar136 + fVar226 * fVar304) * fVar136 + fVar304 * fVar173;
    fVar276 = (fVar279 * fVar137 + fVar226 * fVar315) * fVar137 + fVar315 * fVar201;
    fVar279 = (fVar279 * fVar160 + fVar226 * fVar111) * fVar160 + fVar111 * fVar237;
    fVar220 = fVar149 * fVar135 + (fVar322 * fVar135 + fVar287 * fVar302) * fVar302;
    fVar221 = fVar151 * fVar136 + (fVar322 * fVar136 + fVar287 * fVar304) * fVar304;
    fVar242 = fVar159 * fVar137 + (fVar322 * fVar137 + fVar287 * fVar315) * fVar315;
    fVar256 = fVar161 * fVar160 + (fVar322 * fVar160 + fVar287 * fVar111) * fVar111;
    fVar259 = fVar172 * fVar135 + (fVar327 * fVar135 + fVar298 * fVar302) * fVar302;
    fVar321 = fVar173 * fVar136 + (fVar327 * fVar136 + fVar298 * fVar304) * fVar304;
    fVar226 = fVar201 * fVar137 + (fVar327 * fVar137 + fVar298 * fVar315) * fVar315;
    fVar237 = fVar237 * fVar160 + (fVar327 * fVar160 + fVar298 * fVar111) * fVar111;
    fVar161 = fVar135 * fVar202 + fVar302 * fVar220;
    fVar172 = fVar136 * fVar205 + fVar304 * fVar221;
    fVar173 = fVar137 * fVar206 + fVar315 * fVar242;
    fVar201 = fVar160 * fVar207 + fVar111 * fVar256;
    fVar149 = fVar135 * fVar239 + fVar302 * fVar259;
    fVar151 = fVar136 * fVar264 + fVar304 * fVar321;
    fVar159 = fVar137 * fVar276 + fVar315 * fVar226;
    fVar160 = fVar160 * fVar279 + fVar111 * fVar237;
    fVar111 = (fVar221 - fVar205) * 3.0 * fVar300;
    fVar135 = (fVar242 - fVar206) * 3.0 * fVar300;
    fVar136 = (fVar256 - fVar207) * 3.0 * fVar300;
    fVar137 = (fVar321 - fVar264) * 3.0 * fVar300;
    fVar205 = (fVar226 - fVar276) * 3.0 * fVar300;
    fVar206 = (fVar237 - fVar279) * 3.0 * fVar300;
    local_d8._4_4_ = fVar173;
    local_d8._0_4_ = fVar172;
    local_d8._8_4_ = fVar201;
    local_d8._12_4_ = 0;
    local_f8._4_4_ = fVar159;
    local_f8._0_4_ = fVar151;
    local_f8._8_4_ = fVar160;
    local_f8._12_4_ = 0;
    local_118 = fVar161 + (fVar220 - fVar202) * 3.0 * fVar300;
    fStack_114 = fVar172 + fVar111;
    fStack_110 = fVar173 + fVar135;
    fStack_10c = fVar201 + fVar136;
    local_e8 = fVar149 + (fVar259 - fVar239) * 3.0 * fVar300;
    fStack_e4 = fVar151 + fVar137;
    fStack_e0 = fVar159 + fVar205;
    fStack_dc = fVar160 + fVar206;
    local_b8._0_4_ = fVar172 - fVar111;
    local_b8._4_4_ = fVar173 - fVar135;
    local_b8._8_4_ = fVar201 - fVar136;
    local_b8._12_4_ = 0;
    local_108._0_4_ = fVar151 - fVar137;
    local_108._4_4_ = fVar159 - fVar205;
    local_108._8_4_ = fVar160 - fVar206;
    local_108._12_4_ = 0;
    fVar111 = (fVar172 - fStack_234) + (fVar161 - local_238);
    fVar135 = (fVar173 - fStack_230) + (fVar172 - fStack_234);
    fVar136 = (fVar201 - fStack_22c) + (fVar173 - fStack_230);
    fVar137 = (fVar201 - fStack_22c) + 0.0;
    local_c8._8_4_ = fStack_11c;
    local_c8._12_4_ = 0;
    fVar202 = (fVar151 - fStack_124) + (fVar149 - local_128);
    fVar205 = (fVar159 - fStack_120) + (fVar151 - fStack_124);
    fVar206 = (fVar160 - fStack_11c) + (fVar159 - fStack_120);
    fVar207 = (fVar160 - fStack_11c) + 0.0;
    auVar213._0_8_ =
         CONCAT44(fStack_124 * fVar135 - fStack_234 * fVar205,
                  local_128 * fVar111 - local_238 * fVar202);
    auVar213._8_4_ = fStack_120 * fVar136 - fStack_230 * fVar206;
    auVar213._12_4_ = fStack_11c * fVar137 - fStack_22c * fVar207;
    auVar162._0_4_ = (float)local_338._0_4_ * fVar111 - local_218 * fVar202;
    auVar162._4_4_ = (float)local_338._4_4_ * fVar135 - fStack_214 * fVar205;
    auVar162._8_4_ = fStack_330 * fVar136 - fStack_210 * fVar206;
    auVar162._12_4_ = fStack_32c * fVar137 - fStack_20c * fVar207;
    auVar191._0_8_ =
         CONCAT44((float)local_408._4_4_ * fVar135 - fVar205 * local_228._4_4_,
                  (float)local_408._0_4_ * fVar111 - fVar202 * local_228._0_4_);
    auVar191._8_4_ = fStack_400 * fVar136 - fVar206 * local_228._8_4_;
    auVar191._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
    auVar312._0_4_ = fVar111 * fStack_124 - fVar202 * fStack_234;
    auVar312._4_4_ = fVar135 * fStack_120 - fVar205 * fStack_230;
    auVar312._8_4_ = fVar136 * fStack_11c - fVar206 * fStack_22c;
    auVar312._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
    auVar249._0_8_ =
         CONCAT44(fVar151 * fVar135 - fVar172 * fVar205,fVar149 * fVar111 - fVar161 * fVar202);
    auVar249._8_4_ = fVar159 * fVar136 - fVar173 * fVar206;
    auVar249._12_4_ = fVar160 * fVar137 - fVar201 * fVar207;
    auVar326._0_4_ = local_e8 * fVar111 - local_118 * fVar202;
    auVar326._4_4_ = fStack_e4 * fVar135 - fStack_114 * fVar205;
    auVar326._8_4_ = fStack_e0 * fVar136 - fStack_110 * fVar206;
    auVar326._12_4_ = fStack_dc * fVar137 - fStack_10c * fVar207;
    auVar229._0_8_ =
         CONCAT44(local_108._4_4_ * fVar135 - fVar205 * local_b8._4_4_,
                  local_108._0_4_ * fVar111 - fVar202 * local_b8._0_4_);
    auVar229._8_4_ = local_108._8_4_ * fVar136 - fVar206 * local_b8._8_4_;
    auVar229._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
    auVar95._0_4_ = fVar111 * fVar151 - fVar202 * fVar172;
    auVar95._4_4_ = fVar135 * fVar159 - fVar205 * fVar173;
    auVar95._8_4_ = fVar136 * fVar160 - fVar206 * fVar201;
    auVar95._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
    auVar127._8_4_ = auVar213._8_4_;
    auVar127._0_8_ = auVar213._0_8_;
    auVar127._12_4_ = auVar213._12_4_;
    auVar73 = minps(auVar127,auVar162);
    auVar125 = maxps(auVar213,auVar162);
    auVar163._8_4_ = auVar191._8_4_;
    auVar163._0_8_ = auVar191._0_8_;
    auVar163._12_4_ = auVar191._12_4_;
    auVar139 = minps(auVar163,auVar312);
    auVar73 = minps(auVar73,auVar139);
    auVar139 = maxps(auVar191,auVar312);
    auVar141 = maxps(auVar125,auVar139);
    auVar164._8_4_ = auVar249._8_4_;
    auVar164._0_8_ = auVar249._0_8_;
    auVar164._12_4_ = auVar249._12_4_;
    auVar139 = minps(auVar164,auVar326);
    auVar250 = maxps(auVar249,auVar326);
    auVar192._8_4_ = auVar229._8_4_;
    auVar192._0_8_ = auVar229._0_8_;
    auVar192._12_4_ = auVar229._12_4_;
    auVar125 = minps(auVar192,auVar95);
    auVar139 = minps(auVar139,auVar125);
    auVar73 = minps(auVar73,auVar139);
    auVar139 = maxps(auVar229,auVar95);
    auVar139 = maxps(auVar250,auVar139);
    auVar139 = maxps(auVar141,auVar139);
    auVar214._0_4_ =
         -(uint)(local_148 <= auVar139._0_4_ && auVar73._0_4_ <= local_138) & local_158._0_4_;
    auVar214._4_4_ =
         -(uint)(fStack_144 <= auVar139._4_4_ && auVar73._4_4_ <= fStack_134) & local_158._4_4_;
    auVar214._8_4_ =
         -(uint)(fStack_140 <= auVar139._8_4_ && auVar73._8_4_ <= fStack_130) & local_158._8_4_;
    auVar214._12_4_ =
         -(uint)(fStack_13c <= auVar139._12_4_ && auVar73._12_4_ <= fStack_12c) & local_158._12_4_;
    uVar67 = movmskps((int)uVar58,auVar214);
    uVar58 = (ulong)uVar67;
    if (uVar67 != 0) {
      fVar111 = (fVar172 - fVar161) + (fStack_234 - local_238);
      fVar135 = (fVar173 - fVar172) + (fStack_230 - fStack_234);
      fVar136 = (fVar201 - fVar173) + (fStack_22c - fStack_230);
      fVar137 = (0.0 - fVar201) + (0.0 - fStack_22c);
      fVar202 = (fVar151 - fVar149) + (fStack_124 - local_128);
      fVar205 = (fVar159 - fVar151) + (fStack_120 - fStack_124);
      fVar206 = (fVar160 - fVar159) + (fStack_11c - fStack_120);
      fVar207 = (0.0 - fVar160) + (0.0 - fStack_11c);
      auVar330._0_8_ =
           CONCAT44(fStack_124 * fVar135 - fStack_234 * fVar205,
                    local_128 * fVar111 - local_238 * fVar202);
      auVar330._8_4_ = fStack_120 * fVar136 - fStack_230 * fVar206;
      auVar330._12_4_ = fStack_11c * fVar137 - fStack_22c * fVar207;
      auVar165._0_4_ = (float)local_338._0_4_ * fVar111 - local_218 * fVar202;
      auVar165._4_4_ = (float)local_338._4_4_ * fVar135 - fStack_214 * fVar205;
      auVar165._8_4_ = fStack_330 * fVar136 - fStack_210 * fVar206;
      auVar165._12_4_ = fStack_32c * fVar137 - fStack_20c * fVar207;
      auVar230._0_8_ =
           CONCAT44((float)local_408._4_4_ * fVar135 - local_228._4_4_ * fVar205,
                    (float)local_408._0_4_ * fVar111 - local_228._0_4_ * fVar202);
      auVar230._8_4_ = fStack_400 * fVar136 - local_228._8_4_ * fVar206;
      auVar230._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
      auVar193._0_4_ = fStack_124 * fVar111 - fStack_234 * fVar202;
      auVar193._4_4_ = fStack_120 * fVar135 - fStack_230 * fVar205;
      auVar193._8_4_ = fStack_11c * fVar136 - fStack_22c * fVar206;
      auVar193._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
      auVar146._0_8_ =
           CONCAT44(fVar151 * fVar135 - fVar172 * fVar205,fVar149 * fVar111 - fVar161 * fVar202);
      auVar146._8_4_ = fVar159 * fVar136 - fVar173 * fVar206;
      auVar146._12_4_ = fVar160 * fVar137 - fVar201 * fVar207;
      auVar271._0_4_ = local_e8 * fVar111 - local_118 * fVar202;
      auVar271._4_4_ = fStack_e4 * fVar135 - fStack_114 * fVar205;
      auVar271._8_4_ = fStack_e0 * fVar136 - fStack_110 * fVar206;
      auVar271._12_4_ = fStack_dc * fVar137 - fStack_10c * fVar207;
      auVar313._0_8_ =
           CONCAT44(local_108._4_4_ * fVar135 - local_b8._4_4_ * fVar205,
                    local_108._0_4_ * fVar111 - local_b8._0_4_ * fVar202);
      auVar313._8_4_ = local_108._8_4_ * fVar136 - local_b8._8_4_ * fVar206;
      auVar313._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
      auVar96._0_4_ = fVar111 * fVar151 - fVar202 * fVar172;
      auVar96._4_4_ = fVar135 * fVar159 - fVar205 * fVar173;
      auVar96._8_4_ = fVar136 * fVar160 - fVar206 * fVar201;
      auVar96._12_4_ = fVar137 * 0.0 - fVar207 * 0.0;
      auVar128._8_4_ = auVar330._8_4_;
      auVar128._0_8_ = auVar330._0_8_;
      auVar128._12_4_ = auVar330._12_4_;
      auVar73 = minps(auVar128,auVar165);
      auVar125 = maxps(auVar330,auVar165);
      auVar166._8_4_ = auVar230._8_4_;
      auVar166._0_8_ = auVar230._0_8_;
      auVar166._12_4_ = auVar230._12_4_;
      auVar139 = minps(auVar166,auVar193);
      auVar73 = minps(auVar73,auVar139);
      auVar139 = maxps(auVar230,auVar193);
      auVar250 = maxps(auVar125,auVar139);
      auVar167._8_4_ = auVar146._8_4_;
      auVar167._0_8_ = auVar146._0_8_;
      auVar167._12_4_ = auVar146._12_4_;
      auVar125 = minps(auVar167,auVar271);
      auVar139 = maxps(auVar146,auVar271);
      auVar194._8_4_ = auVar313._8_4_;
      auVar194._0_8_ = auVar313._0_8_;
      auVar194._12_4_ = auVar313._12_4_;
      auVar141 = minps(auVar194,auVar96);
      auVar125 = minps(auVar125,auVar141);
      auVar73 = minps(auVar73,auVar125);
      auVar125 = maxps(auVar313,auVar96);
      auVar139 = maxps(auVar139,auVar125);
      auVar139 = maxps(auVar250,auVar139);
      auVar331._0_4_ =
           -(uint)(local_148 <= auVar139._0_4_ && auVar73._0_4_ <= local_138) & auVar214._0_4_;
      auVar331._4_4_ =
           -(uint)(fStack_144 <= auVar139._4_4_ && auVar73._4_4_ <= fStack_134) & auVar214._4_4_;
      auVar331._8_4_ =
           -(uint)(fStack_140 <= auVar139._8_4_ && auVar73._8_4_ <= fStack_130) & auVar214._8_4_;
      auVar331._12_4_ =
           -(uint)(fStack_13c <= auVar139._12_4_ && auVar73._12_4_ <= fStack_12c) & auVar214._12_4_;
      uVar67 = movmskps(uVar67,auVar331);
      uVar58 = (ulong)uVar67;
      auVar326 = local_f8;
      if (uVar67 != 0) {
        uVar58 = (ulong)(byte)uVar67;
        afStack_1e8[uVar60] = (float)(uVar67 & 0xff);
        *(undefined8 *)(afStack_78 + uVar60 * 2) = local_3f8;
        *(ulong *)(afStack_58 + uVar60 * 2) = CONCAT44(fVar109,fVar72);
        uVar60 = (ulong)((int)uVar60 + 1);
      }
    }
LAB_00af0877:
    auVar73 = _local_408;
    if ((int)uVar60 == 0) {
      if ((uVar63 & 1) != 0) goto LAB_00af197f;
      fVar150 = ray->tfar;
      auVar134._4_4_ = -(uint)(fStack_164 <= fVar150);
      auVar134._0_4_ = -(uint)(local_168 <= fVar150);
      auVar134._8_4_ = -(uint)(fStack_160 <= fVar150);
      auVar134._12_4_ = -(uint)(fStack_15c <= fVar150);
      uVar67 = movmskps((int)uVar58,auVar134);
      uVar65 = uVar65 & uVar65 + 0xf & uVar67;
      if (uVar65 != 0) goto LAB_00aef560;
      goto LAB_00af197f;
    }
    uVar67 = (int)uVar60 - 1;
    uVar58 = (ulong)uVar67;
    fVar111 = afStack_1e8[uVar58];
    fVar72 = afStack_58[uVar58 * 2];
    fVar109 = afStack_58[uVar58 * 2 + 1];
    uVar9 = 0;
    if (fVar111 != 0.0) {
      for (; ((uint)fVar111 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    fVar111 = (float)((int)fVar111 - 1U & (uint)fVar111);
    afStack_1e8[uVar58] = fVar111;
    if (fVar111 == 0.0) {
      uVar60 = (ulong)uVar67;
    }
    fVar135 = (float)(uVar9 + 1) * 0.33333334;
    fVar136 = afStack_78[uVar58 * 2];
    fVar137 = afStack_78[uVar58 * 2 + 1];
    fVar111 = fVar136 * (1.0 - (float)uVar9 * 0.33333334) + fVar137 * (float)uVar9 * 0.33333334;
    fVar135 = fVar136 * (1.0 - fVar135) + fVar137 * fVar135;
    fVar149 = fVar136 * 0.0 + fVar137 * 0.0;
    fVar137 = fVar136 * 0.0 + fVar137 * 0.0;
    fVar136 = fVar135 - fVar111;
    if (fVar136 < 0.16666667) {
      fVar205 = 1.0 - fVar72;
      fVar206 = 1.0 - fVar72;
      fVar221 = 1.0 - fVar109;
      fVar242 = 1.0 - fVar109;
      fVar172 = (float)local_2b8._0_4_ * fVar205 + local_2f8 * fVar72;
      fVar201 = (float)local_2b8._4_4_ * fVar206 + fStack_2f4 * fVar72;
      fVar151 = fStack_2b0 * fVar221 + fStack_2f0 * fVar109;
      fVar159 = fStack_2ac * fVar242 + fStack_2ec * fVar109;
      fVar160 = (float)local_2c8._0_4_ * fVar205 + (float)local_308._0_4_ * fVar72;
      fVar161 = (float)local_2c8._4_4_ * fVar206 + (float)local_308._4_4_ * fVar72;
      fVar173 = fStack_2c0 * fVar221 + fStack_300 * fVar109;
      fVar202 = fStack_2bc * fVar242 + fStack_2fc * fVar109;
      fVar321 = (float)local_2d8._0_4_ * fVar205 + local_318 * fVar72;
      fVar237 = (float)local_2d8._4_4_ * fVar206 + fStack_314 * fVar72;
      fVar264 = fStack_2d0 * fVar221 + fStack_310 * fVar109;
      fVar279 = fStack_2cc * fVar242 + fStack_30c * fVar109;
      fVar207 = (fVar205 * (float)local_2e8._0_4_ + fVar72 * (float)local_328._0_4_) - fVar321;
      fVar220 = (fVar206 * (float)local_2e8._4_4_ + fVar72 * (float)local_328._4_4_) - fVar237;
      fVar256 = (fVar221 * fStack_2e0 + fVar109 * fStack_320) - fVar264;
      fVar259 = (fVar242 * fStack_2dc + fVar109 * fStack_31c) - fVar279;
      fVar205 = fVar111 * (fVar321 - fVar160) + fVar160;
      fVar206 = fVar111 * (fVar237 - fVar161) + fVar161;
      fVar221 = fVar111 * (fVar264 - fVar173) + fVar173;
      fVar242 = fVar111 * (fVar279 - fVar202) + fVar202;
      fVar226 = (fVar321 - fVar160) * fVar135 + fVar160;
      fVar239 = (fVar237 - fVar161) * fVar135 + fVar161;
      fVar276 = (fVar264 - fVar173) * fVar135 + fVar173;
      fVar287 = (fVar279 - fVar202) * fVar135 + fVar202;
      fVar298 = fVar111 * (fVar160 - fVar172) + fVar172;
      fVar300 = fVar111 * (fVar161 - fVar201) + fVar201;
      fVar302 = fVar111 * (fVar173 - fVar151) + fVar151;
      fVar304 = fVar111 * (fVar202 - fVar159) + fVar159;
      fVar298 = (fVar205 - fVar298) * fVar111 + fVar298;
      fVar300 = (fVar206 - fVar300) * fVar111 + fVar300;
      fVar302 = (fVar221 - fVar302) * fVar111 + fVar302;
      fVar304 = (fVar242 - fVar304) * fVar111 + fVar304;
      fVar205 = (((fVar111 * fVar207 + fVar321) - fVar205) * fVar111 + fVar205) - fVar298;
      fVar206 = (((fVar111 * fVar220 + fVar237) - fVar206) * fVar111 + fVar206) - fVar300;
      fVar221 = (((fVar111 * fVar256 + fVar264) - fVar221) * fVar111 + fVar221) - fVar302;
      fVar242 = (((fVar111 * fVar259 + fVar279) - fVar242) * fVar111 + fVar242) - fVar304;
      auVar147._0_4_ = fVar111 * fVar205 + fVar298;
      auVar147._4_4_ = fVar111 * fVar206 + fVar300;
      auVar147._8_4_ = fVar111 * fVar221 + fVar302;
      auVar147._12_4_ = fVar111 * fVar242 + fVar304;
      fVar298 = (float)DAT_01f7ff50;
      fVar300 = DAT_01f7ff50._4_4_;
      fVar302 = DAT_01f7ff50._8_4_;
      fVar304 = DAT_01f7ff50._12_4_;
      fVar172 = (fVar160 - fVar172) * fVar135 + fVar172;
      fVar201 = (fVar161 - fVar201) * fVar135 + fVar201;
      fVar151 = (fVar173 - fVar151) * fVar135 + fVar151;
      fVar159 = (fVar202 - fVar159) * fVar135 + fVar159;
      fVar172 = (fVar226 - fVar172) * fVar135 + fVar172;
      fVar201 = (fVar239 - fVar201) * fVar135 + fVar201;
      fVar151 = (fVar276 - fVar151) * fVar135 + fVar151;
      fVar159 = (fVar287 - fVar159) * fVar135 + fVar159;
      fVar160 = (((fVar207 * fVar135 + fVar321) - fVar226) * fVar135 + fVar226) - fVar172;
      fVar161 = (((fVar220 * fVar135 + fVar237) - fVar239) * fVar135 + fVar239) - fVar201;
      fVar173 = (((fVar256 * fVar135 + fVar264) - fVar276) * fVar135 + fVar276) - fVar151;
      fVar202 = (((fVar259 * fVar135 + fVar279) - fVar287) * fVar135 + fVar287) - fVar159;
      fVar172 = fVar135 * fVar160 + fVar172;
      fVar201 = fVar135 * fVar161 + fVar201;
      fVar111 = fVar135 * fVar173 + fVar151;
      fVar135 = fVar135 * fVar202 + fVar159;
      fVar151 = fVar136 * 0.33333334;
      fVar207 = fVar205 * fVar298 * fVar151 + auVar147._0_4_;
      fVar220 = fVar206 * fVar300 * fVar151 + auVar147._4_4_;
      fVar221 = fVar221 * fVar302 * fVar151 + auVar147._8_4_;
      fVar242 = fVar242 * fVar304 * fVar151 + auVar147._12_4_;
      fVar256 = fVar172 - fVar151 * fVar160 * fVar298;
      fVar259 = fVar201 - fVar151 * fVar161 * fVar300;
      fVar321 = fVar111 - fVar151 * fVar173 * fVar302;
      fVar226 = fVar135 - fVar151 * fVar202 * fVar304;
      auVar26._4_8_ = auVar326._8_8_;
      auVar26._0_4_ = auVar147._4_4_;
      auVar323._0_8_ = auVar26._0_8_ << 0x20;
      auVar323._8_4_ = auVar147._8_4_;
      auVar323._12_4_ = auVar147._12_4_;
      auVar324._8_8_ = auVar147._8_8_;
      auVar324._0_8_ = auVar323._8_8_;
      auVar27._4_8_ = DAT_01f7ff50._8_8_;
      auVar27._0_4_ = fVar201;
      auVar231._0_8_ = auVar27._0_8_ << 0x20;
      auVar231._8_4_ = fVar111;
      auVar231._12_4_ = fVar135;
      fVar173 = (fVar111 - fVar172) + (auVar147._8_4_ - auVar147._0_4_);
      fVar202 = (fVar135 - fVar201) + (auVar147._12_4_ - auVar147._4_4_);
      auVar251._0_4_ = fVar259 * fVar202;
      auVar251._4_4_ = fVar259 * fVar202;
      auVar251._8_4_ = fVar226 * fVar202;
      auVar251._12_4_ = fVar226 * fVar202;
      fVar151 = auVar147._0_4_ * fVar173 + auVar147._4_4_ * fVar202;
      fVar159 = auVar147._8_4_ * fVar173 + auVar147._12_4_ * fVar202;
      fVar205 = fVar207 * fVar173 + fVar220 * fVar202;
      fVar206 = fVar221 * fVar173 + fVar242 * fVar202;
      fVar237 = fVar256 * fVar173 + auVar251._0_4_;
      auVar215._0_8_ = CONCAT44(fVar259 * fVar173 + auVar251._4_4_,fVar237);
      auVar215._8_4_ = fVar321 * fVar173 + auVar251._8_4_;
      auVar215._12_4_ = fVar226 * fVar173 + auVar251._12_4_;
      fVar161 = fVar173 * fVar172 + fVar202 * fVar201;
      fVar239 = fVar173 * fVar111 + fVar202 * fVar135;
      auVar28._4_8_ = auVar251._8_8_;
      auVar28._0_4_ = fVar220 * fVar173 + fVar220 * fVar202;
      auVar252._0_8_ = auVar28._0_8_ << 0x20;
      auVar252._8_4_ = fVar206;
      auVar252._12_4_ = fVar242 * fVar173 + fVar242 * fVar202;
      fVar160 = fVar205;
      if (fVar205 <= fVar151) {
        fVar160 = fVar151;
        fVar151 = fVar205;
      }
      auVar253._8_8_ = auVar252._8_8_;
      auVar253._0_8_ = auVar253._8_8_;
      auVar97._8_4_ = auVar215._8_4_;
      auVar97._0_8_ = auVar215._0_8_;
      auVar97._12_4_ = auVar215._12_4_;
      if (fVar161 <= fVar237) {
        auVar97._0_4_ = fVar161;
      }
      if (auVar97._0_4_ <= fVar151) {
        fVar151 = auVar97._0_4_;
      }
      auVar29._4_8_ = auVar97._8_8_;
      auVar29._0_4_ = fVar173 * fVar201 + fVar202 * fVar201;
      auVar98._0_8_ = auVar29._0_8_ << 0x20;
      auVar98._8_4_ = fVar239;
      auVar98._12_4_ = fVar173 * fVar135 + fVar202 * fVar135;
      if (fVar161 <= fVar237) {
        fVar161 = fVar237;
      }
      auVar99._8_8_ = auVar98._8_8_;
      auVar99._0_8_ = auVar99._8_8_;
      if (fVar161 <= fVar160) {
        fVar161 = fVar160;
      }
      if (fVar206 <= fVar159) {
        auVar253._0_4_ = fVar159;
        fVar159 = fVar206;
      }
      auVar129._8_4_ = auVar215._8_4_;
      auVar129._0_8_ = auVar215._8_8_;
      auVar129._12_4_ = auVar215._12_4_;
      if (fVar239 <= auVar215._8_4_) {
        auVar129._0_4_ = fVar239;
      }
      if (auVar129._0_4_ <= fVar159) {
        fVar159 = auVar129._0_4_;
      }
      if (fVar239 <= auVar215._8_4_) {
        auVar99._0_4_ = auVar215._8_4_;
      }
      if (auVar99._0_4_ <= auVar253._0_4_) {
        auVar99._0_4_ = auVar253._0_4_;
      }
      bVar64 = 3 < (uint)uVar60;
      uVar30 = (undefined3)(uVar67 >> 8);
      uVar58 = (ulong)CONCAT31(uVar30,bVar64);
      fVar160 = auVar99._0_4_;
      if ((0.0001 <= fVar151) || (fVar160 <= -0.0001)) break;
      goto LAB_00af0bd7;
    }
  } while( true );
  if ((fVar159 < 0.0001 && -0.0001 < fVar161) ||
     ((fVar151 < 0.0001 && -0.0001 < fVar161 ||
      (auVar326 = auVar324, fVar159 < 0.0001 && -0.0001 < fVar160)))) {
LAB_00af0bd7:
    local_408 = (undefined1  [8])auVar231._8_8_;
    bVar64 = bVar64 || fVar136 < 0.001;
    uVar58 = (ulong)CONCAT31(uVar30,bVar64);
    fVar202 = (float)(~-(uint)(fVar151 < 0.0) & 0x3f800000 | -(uint)(fVar151 < 0.0) & 0xbf800000);
    fVar205 = (float)(~-(uint)(fVar161 < 0.0) & 0x3f800000 | -(uint)(fVar161 < 0.0) & 0xbf800000);
    fVar173 = 0.0;
    if ((fVar202 == fVar205) && (!NAN(fVar202) && !NAN(fVar205))) {
      fVar173 = INFINITY;
    }
    fVar206 = 0.0;
    if ((fVar202 == fVar205) && (!NAN(fVar202) && !NAN(fVar205))) {
      fVar206 = -INFINITY;
    }
    fVar237 = (float)(~-(uint)(fVar159 < 0.0) & 0x3f800000 | -(uint)(fVar159 < 0.0) & 0xbf800000);
    if ((fVar202 != fVar237) || (fVar239 = fVar206, NAN(fVar202) || NAN(fVar237))) {
      if ((fVar159 != fVar151) || (NAN(fVar159) || NAN(fVar151))) {
        fVar159 = -fVar151 / (fVar159 - fVar151);
        fVar159 = (1.0 - fVar159) * 0.0 + fVar159;
        fVar239 = fVar159;
      }
      else {
        fVar159 = 0.0;
        if ((fVar151 != 0.0) || (fVar239 = 1.0, NAN(fVar151))) {
          fVar159 = INFINITY;
          fVar239 = -INFINITY;
        }
      }
      if (fVar159 <= fVar173) {
        fVar173 = fVar159;
      }
      if (fVar239 <= fVar206) {
        fVar239 = fVar206;
      }
    }
    fVar151 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar160 < 0.0) * 4);
    if ((fVar205 != fVar151) || (fVar159 = fVar239, NAN(fVar205) || NAN(fVar151))) {
      if ((fVar160 != fVar161) || (NAN(fVar160) || NAN(fVar161))) {
        fVar202 = -fVar161 / (fVar160 - fVar161);
        fVar202 = (1.0 - fVar202) * 0.0 + fVar202;
        fVar159 = fVar202;
      }
      else {
        fVar202 = 0.0;
        if ((fVar161 != 0.0) || (fVar159 = 1.0, NAN(fVar161))) {
          fVar202 = INFINITY;
          fVar159 = -INFINITY;
        }
      }
      if (fVar202 <= fVar173) {
        fVar173 = fVar202;
      }
      if (fVar159 <= fVar239) {
        fVar159 = fVar239;
      }
    }
    if ((fVar237 != fVar151) || (NAN(fVar237) || NAN(fVar151))) {
      fVar173 = (float)(~-(uint)(fVar173 < 1.0) & 0x3f800000 |
                       (uint)fVar173 & -(uint)(fVar173 < 1.0));
      fVar159 = (float)(~-(uint)(fVar159 < 1.0) & (uint)fVar159 |
                       -(uint)(fVar159 < 1.0) & 0x3f800000);
    }
    fVar173 = (float)(~-(uint)(fVar173 < 0.0) & (uint)fVar173);
    fVar151 = (float)(~-(uint)(fVar159 < 1.0) & 0x3f800000 | (uint)fVar159 & -(uint)(fVar159 < 1.0))
    ;
    auVar326 = _DAT_01f7ff50;
    _local_338 = auVar324;
    if (fVar173 <= fVar151) {
      fVar173 = fVar173 + -0.1;
      fVar151 = fVar151 + 0.1;
      uVar67 = -(uint)(fVar151 < 1.0);
      fVar173 = (float)(~-(uint)(fVar173 < 0.0) & (uint)fVar173);
      fVar151 = (float)(~uVar67 & 0x3f800000 | (uint)fVar151 & uVar67);
      fVar239 = 1.0 - fVar173;
      fVar264 = 1.0 - fVar173;
      fVar276 = 1.0 - fVar151;
      fVar279 = 1.0 - fVar151;
      fStack_400 = auVar73._8_4_;
      fStack_3fc = auVar73._12_4_;
      fVar159 = auVar147._0_4_ * fVar239 + auVar147._8_4_ * fVar173;
      fVar161 = auVar147._4_4_ * fVar264 + auVar147._12_4_ * fVar173;
      fVar202 = auVar147._0_4_ * fVar276 + auVar147._8_4_ * fVar151;
      fVar205 = auVar147._4_4_ * fVar279 + auVar147._12_4_ * fVar151;
      fVar206 = fVar207 * fVar239 + fVar221 * fVar173;
      fVar237 = fVar220 * fVar264 + fVar242 * fVar173;
      fVar207 = fVar207 * fVar276 + fVar221 * fVar151;
      fVar220 = fVar220 * fVar279 + fVar242 * fVar151;
      fVar221 = fVar256 * fVar239 + fVar321 * fVar173;
      fVar242 = fVar259 * fVar264 + fVar226 * fVar173;
      fVar256 = fVar256 * fVar276 + fVar321 * fVar151;
      fVar259 = fVar259 * fVar279 + fVar226 * fVar151;
      fVar321 = fVar239 * fVar172 + fVar111 * fVar173;
      fVar226 = fVar264 * fVar201 + fVar135 * fVar173;
      fVar172 = fVar276 * fVar172 + fStack_400 * fVar151;
      fVar201 = fVar279 * fVar201 + fStack_3fc * fVar151;
      fVar239 = fVar72 * (1.0 - fVar151);
      fVar72 = fVar72 * (1.0 - fVar173) + fVar109 * fVar173;
      fVar109 = fVar239 + fVar109 * fVar151;
      fVar136 = 1.0 / fVar136;
      auVar130._0_4_ = fVar172 - fVar321;
      auVar130._4_4_ = fVar201 - fVar226;
      auVar130._8_4_ = fVar172 - fVar172;
      auVar130._12_4_ = fVar201 - fVar201;
      auVar157._0_8_ = CONCAT44(fVar259 - fVar242,fVar256 - fVar221);
      auVar157._8_4_ = fVar256 - fVar256;
      auVar157._12_4_ = fVar259 - fVar259;
      auVar195._0_4_ = fVar207 - fVar206;
      auVar195._4_4_ = fVar220 - fVar237;
      auVar195._8_4_ = fVar207 - fVar207;
      auVar195._12_4_ = fVar220 - fVar220;
      auVar254._0_8_ = CONCAT44((fVar237 - fVar161) * fVar300,(fVar206 - fVar159) * fVar298);
      auVar254._8_4_ = (fVar207 - fVar202) * fVar302;
      auVar254._12_4_ = (fVar220 - fVar205) * fVar304;
      auVar168._0_8_ = CONCAT44((fVar242 - fVar237) * fVar300,(fVar221 - fVar206) * fVar298);
      auVar168._8_4_ = (fVar256 - fVar207) * fVar302;
      auVar168._12_4_ = (fVar259 - fVar220) * fVar304;
      auVar294._0_4_ = (fVar321 - fVar221) * fVar298;
      auVar294._4_4_ = (fVar226 - fVar242) * fVar300;
      auVar294._8_4_ = (fVar172 - fVar256) * fVar302;
      auVar294._12_4_ = (fVar201 - fVar259) * fVar304;
      auVar216._8_4_ = auVar168._8_4_;
      auVar216._0_8_ = auVar168._0_8_;
      auVar216._12_4_ = auVar168._12_4_;
      auVar139 = minps(auVar216,auVar294);
      auVar73 = maxps(auVar168,auVar294);
      auVar272._8_4_ = auVar254._8_4_;
      auVar272._0_8_ = auVar254._0_8_;
      auVar272._12_4_ = auVar254._12_4_;
      auVar141 = minps(auVar272,auVar139);
      auVar125 = maxps(auVar254,auVar73);
      auVar31._4_8_ = auVar73._8_8_;
      auVar31._0_4_ = auVar141._4_4_;
      auVar169._0_8_ = auVar31._0_8_ << 0x20;
      auVar169._8_4_ = auVar141._8_4_;
      auVar169._12_4_ = auVar141._12_4_;
      auVar170._8_8_ = auVar141._8_8_;
      auVar170._0_8_ = auVar169._8_8_;
      auVar32._4_8_ = auVar139._8_8_;
      auVar32._0_4_ = auVar125._4_4_;
      auVar217._0_8_ = auVar32._0_8_ << 0x20;
      auVar217._8_4_ = auVar125._8_4_;
      auVar217._12_4_ = auVar125._12_4_;
      auVar218._8_8_ = auVar125._8_8_;
      auVar218._0_8_ = auVar217._8_8_;
      auVar139 = minps(auVar141,auVar170);
      auVar73 = maxps(auVar125,auVar218);
      fVar315 = auVar139._0_4_ * fVar136;
      fVar317 = auVar139._4_4_ * fVar136;
      fVar319 = auVar139._8_4_ * fVar136;
      fVar322 = auVar139._12_4_ * fVar136;
      fVar242 = fVar136 * auVar73._0_4_;
      fVar259 = fVar136 * auVar73._4_4_;
      fVar226 = fVar136 * auVar73._8_4_;
      fVar136 = fVar136 * auVar73._12_4_;
      fVar279 = 1.0 / (fVar109 - fVar72);
      auVar100._0_8_ = CONCAT44(fVar205 - fVar161,fVar202 - fVar159);
      auVar100._8_4_ = fVar202 - fVar202;
      auVar100._12_4_ = fVar205 - fVar205;
      auVar232._8_4_ = auVar100._8_4_;
      auVar232._0_8_ = auVar100._0_8_;
      auVar232._12_4_ = auVar100._12_4_;
      auVar125 = minps(auVar232,auVar195);
      auVar73 = maxps(auVar100,auVar195);
      auVar148._8_4_ = auVar157._8_4_;
      auVar148._0_8_ = auVar157._0_8_;
      auVar148._12_4_ = auVar157._12_4_;
      auVar139 = minps(auVar148,auVar130);
      auVar125 = minps(auVar125,auVar139);
      auVar139 = maxps(auVar157,auVar130);
      auVar73 = maxps(auVar73,auVar139);
      fVar264 = auVar125._0_4_ * fVar279;
      fVar276 = auVar125._4_4_ * fVar279;
      fVar287 = fVar279 * auVar73._0_4_;
      fVar279 = fVar279 * auVar73._4_4_;
      local_408._4_4_ = fVar72;
      local_408._0_4_ = fVar111;
      fStack_400 = fVar135;
      fStack_3fc = fVar109;
      auVar219._4_4_ = fVar109;
      auVar219._0_4_ = fVar135;
      auVar219._8_4_ = fVar149;
      auVar219._12_4_ = fVar137;
      fVar206 = (fVar111 + fVar135) * 0.5;
      fVar207 = (fVar72 + fVar109) * 0.5;
      fVar220 = (fVar135 + fVar149) * 0.0;
      fVar221 = (fVar109 + fVar137) * 0.0;
      fVar151 = local_88 * fVar206 + (float)local_1f8;
      fVar159 = fStack_84 * fVar206 + local_1f8._4_4_;
      fVar161 = fStack_80 * fVar206 + fStack_1f0;
      fVar172 = fStack_7c * fVar206 + fStack_1ec;
      fVar173 = local_98 * fVar206 + local_298;
      fVar201 = fStack_94 * fVar206 + fStack_294;
      fVar202 = fStack_90 * fVar206 + (float)uStack_290;
      fVar205 = fStack_8c * fVar206 + uStack_290._4_4_;
      fVar151 = (fVar173 - fVar151) * fVar206 + fVar151;
      fVar159 = (fVar201 - fVar159) * fVar206 + fVar159;
      fVar161 = (fVar202 - fVar161) * fVar206 + fVar161;
      fVar172 = (fVar205 - fVar172) * fVar206 + fVar172;
      fVar173 = (((local_a8 * fVar206 + (float)local_2a8) - fVar173) * fVar206 + fVar173) - fVar151;
      fVar201 = (((fStack_a4 * fVar206 + local_2a8._4_4_) - fVar201) * fVar206 + fVar201) - fVar159;
      fVar202 = (((fStack_a0 * fVar206 + fStack_2a0) - fVar202) * fVar206 + fVar202) - fVar161;
      fVar205 = (((fStack_9c * fVar206 + fStack_29c) - fVar205) * fVar206 + fVar205) - fVar172;
      fVar151 = fVar206 * fVar173 + fVar151;
      fVar159 = fVar206 * fVar201 + fVar159;
      fVar173 = fVar173 * fVar298;
      fVar201 = fVar201 * fVar300;
      fVar161 = (fVar206 * fVar202 + fVar161) - fVar151;
      fVar172 = (fVar206 * fVar205 + fVar172) - fVar159;
      fVar173 = (fVar202 * fVar302 - fVar173) * fVar207 + fVar173;
      fVar201 = (fVar205 * fVar304 - fVar201) * fVar207 + fVar201;
      auVar158._0_8_ = CONCAT44(fVar173,fVar161) ^ 0x80000000;
      auVar158._8_4_ = fVar173;
      auVar158._12_4_ = fVar173;
      fVar298 = fVar111 - fVar206;
      fVar300 = fVar72 - fVar207;
      fVar302 = fVar135 - fVar220;
      fVar304 = fVar109 - fVar221;
      fVar327 = fVar135 - fVar206;
      fVar328 = fVar109 - fVar207;
      fVar149 = fVar149 - fVar220;
      fVar137 = fVar137 - fVar221;
      fVar151 = fVar161 * fVar207 + fVar151;
      fVar159 = fVar172 * fVar207 + fVar159;
      auVar171._0_8_ = CONCAT44(fVar201,fVar172) ^ 0x8000000000000000;
      auVar171._8_4_ = -fVar201;
      auVar171._12_4_ = -fVar201;
      auVar101._0_4_ = fVar172 * fVar173 - fVar201 * fVar161;
      auVar101._4_4_ = auVar101._0_4_;
      auVar101._8_4_ = auVar101._0_4_;
      auVar101._12_4_ = auVar101._0_4_;
      auVar139 = divps(auVar171,auVar101);
      auVar73 = divps(auVar158,auVar101);
      fVar220 = auVar139._0_4_;
      fVar221 = auVar139._4_4_;
      fVar202 = auVar73._0_4_;
      fVar205 = auVar73._4_4_;
      fVar206 = fVar206 - (fVar159 * fVar202 + fVar151 * fVar220);
      fVar173 = fVar207 - (fVar159 * fVar205 + fVar151 * fVar221);
      fVar201 = fVar207 - (fVar159 * auVar73._8_4_ + fVar151 * auVar139._8_4_);
      fVar207 = fVar207 - (fVar159 * auVar73._12_4_ + fVar151 * auVar139._12_4_);
      auVar131._0_8_ = CONCAT44(fVar221 * fVar264,fVar221 * fVar315);
      auVar131._8_4_ = fVar221 * fVar317;
      auVar131._12_4_ = fVar221 * fVar276;
      auVar102._0_4_ = fVar221 * fVar242;
      auVar102._4_4_ = fVar221 * fVar287;
      auVar102._8_4_ = fVar221 * fVar259;
      auVar102._12_4_ = fVar221 * fVar279;
      auVar333._8_4_ = auVar131._8_4_;
      auVar333._0_8_ = auVar131._0_8_;
      auVar333._12_4_ = auVar131._12_4_;
      auVar141 = minps(auVar333,auVar102);
      auVar73 = maxps(auVar102,auVar131);
      auVar196._0_8_ = CONCAT44(fVar205 * fVar276,fVar205 * fVar317);
      auVar196._8_4_ = fVar205 * fVar319;
      auVar196._12_4_ = fVar205 * fVar322;
      auVar132._0_4_ = fVar205 * fVar259;
      auVar132._4_4_ = fVar205 * fVar279;
      auVar132._8_4_ = fVar205 * fVar226;
      auVar132._12_4_ = fVar205 * fVar136;
      auVar273._8_4_ = auVar196._8_4_;
      auVar273._0_8_ = auVar196._0_8_;
      auVar273._12_4_ = auVar196._12_4_;
      auVar125 = minps(auVar273,auVar132);
      auVar139 = maxps(auVar132,auVar196);
      fVar151 = 0.0 - (auVar139._0_4_ + auVar73._0_4_);
      fVar159 = 1.0 - (auVar139._4_4_ + auVar73._4_4_);
      fVar161 = 0.0 - (auVar139._8_4_ + auVar73._8_4_);
      fVar172 = 0.0 - (auVar139._12_4_ + auVar73._12_4_);
      fVar256 = 0.0 - (auVar125._0_4_ + auVar141._0_4_);
      fVar321 = 1.0 - (auVar125._4_4_ + auVar141._4_4_);
      fVar237 = 0.0 - (auVar125._8_4_ + auVar141._8_4_);
      fVar239 = 0.0 - (auVar125._12_4_ + auVar141._12_4_);
      auVar133._0_8_ = CONCAT44(fVar300 * fVar159,fVar298 * fVar151);
      auVar133._8_4_ = fVar302 * fVar161;
      auVar133._12_4_ = fVar304 * fVar172;
      auVar295._0_8_ = CONCAT44(fVar264 * fVar220,fVar315 * fVar220);
      auVar295._8_4_ = fVar317 * fVar220;
      auVar295._12_4_ = fVar276 * fVar220;
      auVar197._0_4_ = fVar220 * fVar242;
      auVar197._4_4_ = fVar220 * fVar287;
      auVar197._8_4_ = fVar220 * fVar259;
      auVar197._12_4_ = fVar220 * fVar279;
      auVar274._8_4_ = auVar295._8_4_;
      auVar274._0_8_ = auVar295._0_8_;
      auVar274._12_4_ = auVar295._12_4_;
      auVar139 = minps(auVar274,auVar197);
      auVar73 = maxps(auVar197,auVar295);
      auVar233._0_8_ = CONCAT44(fVar276 * fVar202,fVar317 * fVar202);
      auVar233._8_4_ = fVar319 * fVar202;
      auVar233._12_4_ = fVar322 * fVar202;
      auVar296._0_4_ = fVar202 * fVar259;
      auVar296._4_4_ = fVar202 * fVar279;
      auVar296._8_4_ = fVar202 * fVar226;
      auVar296._12_4_ = fVar202 * fVar136;
      auVar332._8_4_ = auVar233._8_4_;
      auVar332._0_8_ = auVar233._0_8_;
      auVar332._12_4_ = auVar233._12_4_;
      auVar141 = minps(auVar332,auVar296);
      auVar275._0_4_ = fVar298 * fVar256;
      auVar275._4_4_ = fVar300 * fVar321;
      auVar275._8_4_ = fVar302 * fVar237;
      auVar275._12_4_ = fVar304 * fVar239;
      auVar103._0_8_ = CONCAT44(fVar159 * fVar328,fVar151 * fVar327);
      auVar103._8_4_ = fVar161 * fVar149;
      auVar103._12_4_ = fVar172 * fVar137;
      auVar204._0_4_ = fVar256 * fVar327;
      auVar204._4_4_ = fVar321 * fVar328;
      auVar204._8_4_ = fVar237 * fVar149;
      auVar204._12_4_ = fVar239 * fVar137;
      auVar125 = maxps(auVar296,auVar233);
      fVar136 = 1.0 - (auVar125._0_4_ + auVar73._0_4_);
      fVar151 = 0.0 - (auVar125._4_4_ + auVar73._4_4_);
      fVar159 = 0.0 - (auVar125._8_4_ + auVar73._8_4_);
      fVar161 = 0.0 - (auVar125._12_4_ + auVar73._12_4_);
      fVar172 = 1.0 - (auVar141._0_4_ + auVar139._0_4_);
      fVar242 = 0.0 - (auVar141._4_4_ + auVar139._4_4_);
      fVar256 = 0.0 - (auVar141._8_4_ + auVar139._8_4_);
      fVar259 = 0.0 - (auVar141._12_4_ + auVar139._12_4_);
      auVar234._0_8_ = CONCAT44(fVar300 * fVar151,fVar298 * fVar136);
      auVar234._8_4_ = fVar302 * fVar159;
      auVar234._12_4_ = fVar304 * fVar161;
      auVar314._0_4_ = fVar298 * fVar172;
      auVar314._4_4_ = fVar300 * fVar242;
      auVar314._8_4_ = fVar302 * fVar256;
      auVar314._12_4_ = fVar304 * fVar259;
      auVar198._0_8_ = CONCAT44(fVar151 * fVar328,fVar136 * fVar327);
      auVar198._8_4_ = fVar159 * fVar149;
      auVar198._12_4_ = fVar161 * fVar137;
      auVar255._0_4_ = fVar172 * fVar327;
      auVar255._4_4_ = fVar242 * fVar328;
      auVar255._8_4_ = fVar256 * fVar149;
      auVar255._12_4_ = fVar259 * fVar137;
      auVar297._8_4_ = auVar234._8_4_;
      auVar297._0_8_ = auVar234._0_8_;
      auVar297._12_4_ = auVar234._12_4_;
      auVar73 = minps(auVar297,auVar314);
      auVar325._8_4_ = auVar198._8_4_;
      auVar325._0_8_ = auVar198._0_8_;
      auVar325._12_4_ = auVar198._12_4_;
      auVar326 = minps(auVar325,auVar255);
      auVar250 = minps(auVar73,auVar326);
      auVar139 = maxps(auVar314,auVar234);
      auVar73 = maxps(auVar255,auVar198);
      auVar125 = maxps(auVar73,auVar139);
      auVar235._8_4_ = auVar133._8_4_;
      auVar235._0_8_ = auVar133._0_8_;
      auVar235._12_4_ = auVar133._12_4_;
      auVar139 = minps(auVar235,auVar275);
      auVar199._8_4_ = auVar103._8_4_;
      auVar199._0_8_ = auVar103._0_8_;
      auVar199._12_4_ = auVar103._12_4_;
      auVar73 = minps(auVar199,auVar204);
      auVar139 = minps(auVar139,auVar73);
      auVar141 = maxps(auVar275,auVar133);
      auVar73 = maxps(auVar204,auVar103);
      auVar73 = maxps(auVar73,auVar141);
      auVar236._0_4_ = auVar250._4_4_ + auVar250._0_4_ + fVar206;
      auVar236._4_4_ = auVar139._4_4_ + auVar139._0_4_ + fVar173;
      auVar236._8_4_ = auVar250._8_4_ + auVar250._4_4_ + fVar201;
      auVar236._12_4_ = auVar250._12_4_ + auVar139._4_4_ + fVar207;
      fVar136 = auVar125._4_4_ + auVar125._0_4_ + fVar206;
      fVar137 = auVar73._4_4_ + auVar73._0_4_ + fVar173;
      auVar104._4_4_ = fVar137;
      auVar104._0_4_ = fVar136;
      auVar139 = maxps(_local_408,auVar236);
      auVar104._8_4_ = auVar125._8_4_ + auVar125._4_4_ + fVar201;
      auVar104._12_4_ = auVar125._12_4_ + auVar73._4_4_ + fVar207;
      auVar73 = minps(auVar104,auVar219);
      iVar66 = -(uint)(auVar73._0_4_ < auVar139._0_4_);
      iVar68 = -(uint)(auVar73._4_4_ < auVar139._4_4_);
      auVar106._4_4_ = iVar68;
      auVar106._0_4_ = iVar66;
      auVar106._8_4_ = iVar68;
      auVar106._12_4_ = iVar68;
      auVar105._8_8_ = auVar106._8_8_;
      auVar105._4_4_ = iVar66;
      auVar105._0_4_ = iVar66;
      iVar66 = movmskpd((uint)(fVar160 < 0.0),auVar105);
      if (iVar66 == 0) {
        bVar56 = 0;
        if ((fVar111 < auVar236._0_4_) && (fVar136 < fVar135)) {
          bVar56 = -(fVar137 < fVar109) & fVar72 < auVar236._4_4_;
        }
        bVar56 = bVar64 | bVar56;
        uVar58 = (ulong)CONCAT31(uVar30,bVar56);
        if (bVar56 != 1) goto LAB_00af0220;
        uVar58 = 200;
        do {
          fVar72 = 1.0 - fVar206;
          fVar136 = fVar206 * fVar206 * fVar206;
          fVar135 = fVar206 * fVar206 * 3.0 * fVar72;
          fVar109 = fVar72 * fVar72 * fVar72;
          fVar137 = fVar206 * 3.0 * fVar72 * fVar72;
          fVar111 = fVar109 * (float)local_1f8 +
                    fVar137 * local_298 + fVar135 * (float)local_2a8 + fVar136 * fVar174;
          fVar72 = fVar109 * local_1f8._4_4_ +
                   fVar137 * fStack_294 + fVar135 * local_2a8._4_4_ + fVar136 * fVar200;
          fVar111 = ((fVar109 * fStack_1f0 +
                     fVar137 * (float)uStack_290 + fVar135 * fStack_2a0 + fVar136 * fVar110) -
                    fVar111) * fVar173 + fVar111;
          fVar72 = ((fVar109 * fStack_1ec +
                    fVar137 * uStack_290._4_4_ + fVar135 * fStack_29c + fVar136 * fVar150) - fVar72)
                   * fVar173 + fVar72;
          fVar206 = fVar206 - (fVar72 * fVar202 + fVar111 * fVar220);
          fVar173 = fVar173 - (fVar72 * fVar205 + fVar111 * fVar221);
          fVar111 = (float)((uint)fVar111 & (uint)DAT_01f7b6c0);
          fVar72 = (float)((uint)fVar72 & DAT_01f7b6c0._4_4_);
          if (fVar72 <= fVar111) {
            fVar72 = fVar111;
          }
          auVar326 = _DAT_01f7b6c0;
          if (fVar72 < local_288) {
            if ((((0.0 <= fVar206) && (fVar206 <= 1.0)) && (0.0 <= fVar173)) && (fVar173 <= 1.0)) {
              fVar72 = (pre->ray_space).vx.field_0.m128[2];
              fVar109 = (pre->ray_space).vy.field_0.m128[2];
              fVar111 = (pre->ray_space).vz.field_0.m128[2];
              fVar135 = (ray->org).field_0.m128[0];
              fVar136 = (ray->org).field_0.m128[1];
              fVar137 = (ray->org).field_0.m128[2];
              fVar172 = 1.0 - fVar173;
              fVar161 = 1.0 - fVar206;
              fVar149 = fVar161 * fVar161 * fVar161;
              fVar151 = fVar206 * 3.0 * fVar161 * fVar161;
              fVar160 = fVar206 * fVar206 * fVar206;
              fVar159 = fVar206 * fVar206 * 3.0 * fVar161;
              fVar72 = (((fStack_370 - fVar137) * fVar111 +
                        (fStack_374 - fVar136) * fVar109 + (local_378 - fVar135) * fVar72) * fVar172
                       + ((fStack_360 - fVar137) * fVar111 +
                         (fStack_364 - fVar136) * fVar109 + (local_368 - fVar135) * fVar72) *
                         fVar173) * fVar149 +
                       (((fStack_380 - fVar137) * fVar111 +
                        (fStack_384 - fVar136) * fVar109 + (local_388 - fVar135) * fVar72) * fVar172
                       + ((fStack_350 - fVar137) * fVar111 +
                         (fStack_354 - fVar136) * fVar109 + (local_358 - fVar135) * fVar72) *
                         fVar173) * fVar151 +
                       (((fStack_3a0 - fVar137) * fVar111 +
                        (fStack_3a4 - fVar136) * fVar109 + (local_3a8 - fVar135) * fVar72) * fVar172
                       + ((fStack_3c0 - fVar137) * fVar111 +
                         (fStack_3c4 - fVar136) * fVar109 + (local_3c8 - fVar135) * fVar72) *
                         fVar173) * fVar159 +
                       (fVar172 * ((fStack_390 - fVar137) * fVar111 +
                                  (fStack_394 - fVar136) * fVar109 + (local_398 - fVar135) * fVar72)
                       + ((fStack_200 - fVar137) * fVar111 +
                         (fStack_204 - fVar136) * fVar109 + (local_208 - fVar135) * fVar72) *
                         fVar173) * fVar160;
              if ((ray->org).field_0.m128[3] <= fVar72) {
                fVar109 = ray->tfar;
                auVar326 = ZEXT416((uint)fVar109);
                if (fVar72 <= fVar109) {
                  fVar137 = 1.0 - fVar173;
                  fVar172 = 1.0 - fVar173;
                  fVar201 = 1.0 - fVar173;
                  fVar111 = local_388 * fVar137 + local_358 * fVar173;
                  fVar135 = fStack_384 * fVar172 + fStack_354 * fVar173;
                  fVar136 = fStack_380 * fVar201 + fStack_350 * fVar173;
                  fVar202 = local_3a8 * fVar137 + local_3c8 * fVar173;
                  fVar207 = fStack_3a4 * fVar172 + fStack_3c4 * fVar173;
                  fVar221 = fStack_3a0 * fVar201 + fStack_3c0 * fVar173;
                  fVar205 = fVar202 - fVar111;
                  fVar220 = fVar207 - fVar135;
                  fVar242 = fVar221 - fVar136;
                  fVar111 = (((fVar111 - (local_378 * fVar137 + local_368 * fVar173)) * fVar161 +
                             fVar206 * fVar205) * fVar161 +
                            (fVar205 * fVar161 +
                            ((fVar137 * local_398 + fVar173 * local_208) - fVar202) * fVar206) *
                            fVar206) * 3.0;
                  fVar135 = (((fVar135 - (fStack_374 * fVar172 + fStack_364 * fVar173)) * fVar161 +
                             fVar206 * fVar220) * fVar161 +
                            (fVar220 * fVar161 +
                            ((fVar172 * fStack_394 + fVar173 * fStack_204) - fVar207) * fVar206) *
                            fVar206) * 3.0;
                  fVar136 = (((fVar136 - (fStack_370 * fVar201 + fStack_360 * fVar173)) * fVar161 +
                             fVar206 * fVar242) * fVar161 +
                            (fVar242 * fVar161 +
                            ((fVar201 * fStack_390 + fVar173 * fStack_200) - fVar221) * fVar206) *
                            fVar206) * 3.0;
                  pGVar18 = (context->scene->geometries).items[local_340].ptr;
                  if ((pGVar18->mask & ray->mask) == 0) {
LAB_00af18a1:
                    uVar58 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (uVar58 = CONCAT71((int7)((ulong)context->args >> 8),1),
                          pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar137 = fVar149 * local_178 +
                              fVar151 * local_188 + fVar159 * local_198 + fVar160 * local_1a8;
                    fVar161 = fVar149 * fStack_174 +
                              fVar151 * fStack_184 + fVar159 * fStack_194 + fVar160 * fStack_1a4;
                    fVar149 = fVar149 * fStack_170 +
                              fVar151 * fStack_180 + fVar159 * fStack_190 + fVar160 * fStack_1a0;
                    local_1d8 = CONCAT44(fVar137 * fVar136 - fVar111 * fVar149,
                                         fVar149 * fVar135 - fVar136 * fVar161);
                    local_1d0 = fVar161 * fVar111 - fVar135 * fVar137;
                    local_1cc = fVar206;
                    fStack_1c8 = fVar173;
                    local_1c4 = (int)local_278;
                    local_1c0 = (int)local_340;
                    local_1bc = context->user->instID[0];
                    local_1b8 = context->user->instPrimID[0];
                    ray->tfar = fVar72;
                    local_3cc = 0xffffffff;
                    local_268.valid = &local_3cc;
                    local_268.geometryUserPtr = pGVar18->userPtr;
                    local_268.context = context->user;
                    local_268.hit = (RTCHitN *)&local_1d8;
                    local_268.N = 1;
                    local_3b8._0_4_ = (int)uVar63;
                    local_268.ray = (RTCRayN *)ray;
                    if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar18->occlusionFilterN)(&local_268);
                      uVar63 = (ulong)(uint)local_3b8._0_4_;
                      if (*local_268.valid != 0) goto LAB_00af1852;
LAB_00af1895:
                      ray->tfar = fVar109;
                      goto LAB_00af18a1;
                    }
LAB_00af1852:
                    p_Var59 = context->args->filter;
                    if ((p_Var59 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var59)(&local_268);
                      uVar63 = (ulong)(uint)local_3b8._0_4_;
                      p_Var59 = (RTCFilterFunctionN)local_268.valid;
                      if (*local_268.valid == 0) goto LAB_00af1895;
                    }
                    uVar58 = CONCAT71((int7)((ulong)p_Var59 >> 8),1);
                  }
                  uVar63 = CONCAT71((int7)(uVar63 >> 8),(byte)uVar63 | (byte)uVar58);
                }
              }
            }
            break;
          }
          uVar58 = uVar58 - 1;
        } while (uVar58 != 0);
      }
    }
  }
  goto LAB_00af0877;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }